

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<8,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ushort uVar7;
  ushort uVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  size_t k;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  byte bVar30;
  ushort uVar31;
  uint uVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  byte bVar36;
  long lVar37;
  long lVar38;
  uint *puVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  RayK<4> *pRVar43;
  ulong *puVar44;
  long lVar45;
  undefined1 (*pauVar46) [16];
  NodeRef root;
  undefined4 uVar47;
  byte bVar48;
  byte bVar49;
  ushort uVar50;
  uint uVar51;
  bool bVar52;
  ulong uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar147 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  Precalculations pre;
  vfloat<8> lower_y;
  vfloat<8> upper_y;
  TravRayK<4,_true> tray;
  vfloat<8> upper_x;
  vfloat<8> upper_z;
  vfloat<8> lower_z;
  vfloat<8> lower_x;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 local_3a10 [16];
  Precalculations local_39f1;
  undefined1 local_39f0 [16];
  RayK<4> *local_39e0;
  RayQueryContext *local_39d8;
  long local_39d0;
  uint local_39c4;
  undefined1 local_39c0 [16];
  long local_39a8;
  undefined1 (*local_39a0) [16];
  ulong *local_3998;
  undefined1 local_3990 [16];
  undefined1 local_3980 [16];
  undefined1 local_3970 [16];
  undefined1 local_3960 [16];
  undefined1 local_3950 [16];
  RayK<4> *local_3938;
  ulong local_3930;
  undefined4 local_3924;
  RTCFilterFunctionNArguments local_3920;
  undefined1 local_38f0 [16];
  undefined1 local_38e0 [16];
  undefined1 local_38d0 [16];
  undefined1 local_38c0 [32];
  BVH *local_3890;
  Intersectors *local_3888;
  long local_3880;
  long local_3878;
  long local_3870;
  ulong local_3868;
  undefined1 local_3860 [16];
  undefined1 local_3850 [16];
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_3840;
  undefined1 local_3810 [16];
  undefined1 local_3800 [16];
  undefined1 local_37f0 [16];
  undefined1 local_37e0 [8];
  float fStack_37d8;
  float fStack_37d4;
  undefined1 local_37d0 [8];
  float fStack_37c8;
  float fStack_37c4;
  undefined1 local_37c0 [16];
  int local_37b0;
  int iStack_37ac;
  int iStack_37a8;
  int iStack_37a4;
  uint local_37a0;
  uint uStack_379c;
  uint uStack_3798;
  uint uStack_3794;
  uint local_3790;
  uint uStack_378c;
  uint uStack_3788;
  uint uStack_3784;
  undefined1 local_3780 [16];
  undefined1 local_3770 [16];
  RTCHitN local_3760 [16];
  undefined1 auStack_3750 [16];
  undefined1 local_3740 [16];
  undefined1 local_3730 [16];
  undefined1 local_3720 [16];
  undefined1 local_3710 [16];
  undefined1 local_3700 [16];
  uint local_36f0;
  uint uStack_36ec;
  uint uStack_36e8;
  uint uStack_36e4;
  uint uStack_36e0;
  uint uStack_36dc;
  uint uStack_36d8;
  uint uStack_36d4;
  undefined1 local_36c0 [32];
  undefined1 local_36a0 [32];
  undefined1 local_3670 [16];
  undefined1 local_3660 [16];
  uint local_3650;
  uint uStack_364c;
  uint uStack_3648;
  uint uStack_3644;
  uint local_3640;
  uint uStack_363c;
  uint uStack_3638;
  uint uStack_3634;
  uint local_3630;
  uint uStack_362c;
  uint uStack_3628;
  uint uStack_3624;
  undefined1 local_3620 [16];
  undefined1 local_3610 [16];
  undefined1 local_3600 [32];
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 local_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 local_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 local_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 local_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 local_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 local_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 local_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  size_t local_34f8;
  ulong local_34f0 [560];
  undefined1 local_2370 [16];
  undefined1 local_2360 [16];
  undefined1 local_2350 [8992];
  
  local_3890 = (BVH *)This->ptr;
  if ((local_3890->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar55 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      auVar57 = ZEXT816(0) << 0x40;
      uVar16 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar57,5);
      uVar53 = vpcmpeqd_avx512vl(auVar55,(undefined1  [16])valid_i->field_0);
      uVar53 = ((byte)uVar16 & 0xf) & uVar53;
      bVar36 = (byte)uVar53;
      if (bVar36 != 0) {
        local_3840._0_8_ = *(undefined8 *)ray;
        local_3840._8_8_ = *(undefined8 *)(ray + 8);
        local_3840._16_8_ = *(undefined8 *)(ray + 0x10);
        local_3840._24_8_ = *(undefined8 *)(ray + 0x18);
        local_3840._32_8_ = *(undefined8 *)(ray + 0x20);
        local_3840._40_8_ = *(undefined8 *)(ray + 0x28);
        local_3810 = *(undefined1 (*) [16])(ray + 0x40);
        local_3800 = *(undefined1 (*) [16])(ray + 0x50);
        local_37f0 = *(undefined1 (*) [16])(ray + 0x60);
        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar143 = ZEXT1664(auVar54);
        auVar55 = vandps_avx512vl(local_3810,auVar54);
        auVar126._8_4_ = 0x219392ef;
        auVar126._0_8_ = 0x219392ef219392ef;
        auVar126._12_4_ = 0x219392ef;
        uVar40 = vcmpps_avx512vl(auVar55,auVar126,1);
        auVar127._8_4_ = 0x3f800000;
        auVar127._0_8_ = &DAT_3f8000003f800000;
        auVar127._12_4_ = 0x3f800000;
        auVar55 = vdivps_avx(auVar127,local_3810);
        auVar56 = vandps_avx512vl(local_3800,auVar54);
        uVar41 = vcmpps_avx512vl(auVar56,auVar126,1);
        auVar56 = vdivps_avx(auVar127,local_3800);
        auVar54 = vandps_avx512vl(local_37f0,auVar54);
        uVar34 = vcmpps_avx512vl(auVar54,auVar126,1);
        auVar54 = vdivps_avx(auVar127,local_37f0);
        bVar52 = (bool)((byte)uVar40 & 1);
        local_37e0._0_4_ = (uint)bVar52 * 0x5d5e0b6b | (uint)!bVar52 * auVar55._0_4_;
        bVar52 = (bool)((byte)(uVar40 >> 1) & 1);
        local_37e0._4_4_ = (uint)bVar52 * 0x5d5e0b6b | (uint)!bVar52 * auVar55._4_4_;
        bVar52 = (bool)((byte)(uVar40 >> 2) & 1);
        fStack_37d8 = (float)((uint)bVar52 * 0x5d5e0b6b | (uint)!bVar52 * auVar55._8_4_);
        bVar52 = (bool)((byte)(uVar40 >> 3) & 1);
        fStack_37d4 = (float)((uint)bVar52 * 0x5d5e0b6b | (uint)!bVar52 * auVar55._12_4_);
        bVar52 = (bool)((byte)uVar41 & 1);
        local_37d0._0_4_ = (uint)bVar52 * 0x5d5e0b6b | (uint)!bVar52 * auVar56._0_4_;
        bVar52 = (bool)((byte)(uVar41 >> 1) & 1);
        local_37d0._4_4_ = (uint)bVar52 * 0x5d5e0b6b | (uint)!bVar52 * auVar56._4_4_;
        bVar52 = (bool)((byte)(uVar41 >> 2) & 1);
        fStack_37c8 = (float)((uint)bVar52 * 0x5d5e0b6b | (uint)!bVar52 * auVar56._8_4_);
        bVar52 = (bool)((byte)(uVar41 >> 3) & 1);
        fStack_37c4 = (float)((uint)bVar52 * 0x5d5e0b6b | (uint)!bVar52 * auVar56._12_4_);
        bVar52 = (bool)((byte)uVar34 & 1);
        local_37c0._0_4_ = (uint)bVar52 * 0x5d5e0b6b | (uint)!bVar52 * auVar54._0_4_;
        bVar52 = (bool)((byte)(uVar34 >> 1) & 1);
        local_37c0._4_4_ = (uint)bVar52 * 0x5d5e0b6b | (uint)!bVar52 * auVar54._4_4_;
        bVar52 = (bool)((byte)(uVar34 >> 2) & 1);
        local_37c0._8_4_ = (uint)bVar52 * 0x5d5e0b6b | (uint)!bVar52 * auVar54._8_4_;
        bVar52 = (bool)((byte)(uVar34 >> 3) & 1);
        local_37c0._12_4_ = (uint)bVar52 * 0x5d5e0b6b | (uint)!bVar52 * auVar54._12_4_;
        uVar40 = vcmpps_avx512vl(_local_37e0,auVar57,1);
        auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_37b0 = (uint)((byte)uVar40 & 1) * auVar55._0_4_;
        iStack_37ac = (uint)((byte)(uVar40 >> 1) & 1) * auVar55._4_4_;
        iStack_37a8 = (uint)((byte)(uVar40 >> 2) & 1) * auVar55._8_4_;
        iStack_37a4 = (uint)((byte)(uVar40 >> 3) & 1) * auVar55._12_4_;
        local_3924 = (undefined4)uVar53;
        uVar40 = vcmpps_avx512vl(_local_37d0,auVar57,5);
        auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar52 = (bool)((byte)uVar40 & 1);
        bVar12 = (bool)((byte)(uVar40 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar40 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar40 >> 3) & 1);
        local_37a0 = (uint)bVar52 * auVar55._0_4_ | (uint)!bVar52 * 0x60;
        uStack_379c = (uint)bVar12 * auVar55._4_4_ | (uint)!bVar12 * 0x60;
        uStack_3798 = (uint)bVar13 * auVar55._8_4_ | (uint)!bVar13 * 0x60;
        uStack_3794 = (uint)bVar14 * auVar55._12_4_ | (uint)!bVar14 * 0x60;
        uVar40 = vcmpps_avx512vl(local_37c0,auVar57,5);
        auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar52 = (bool)((byte)uVar40 & 1);
        bVar12 = (bool)((byte)(uVar40 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar40 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar40 >> 3) & 1);
        local_3790 = (uint)bVar52 * auVar55._0_4_ | (uint)!bVar52 * 0xa0;
        uStack_378c = (uint)bVar12 * auVar55._4_4_ | (uint)!bVar12 * 0xa0;
        uStack_3788 = (uint)bVar13 * auVar55._8_4_ | (uint)!bVar13 * 0xa0;
        uStack_3784 = (uint)bVar14 * auVar55._12_4_ | (uint)!bVar14 * 0xa0;
        local_2370 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar144 = ZEXT1664(local_2370);
        auVar55 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar57);
        local_3780._0_4_ =
             (uint)(bVar36 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar36 & 1) * local_2370._0_4_;
        bVar52 = (bool)((byte)(uVar53 >> 1) & 1);
        local_3780._4_4_ = (uint)bVar52 * auVar55._4_4_ | (uint)!bVar52 * local_2370._4_4_;
        bVar52 = (bool)((byte)(uVar53 >> 2) & 1);
        local_3780._8_4_ = (uint)bVar52 * auVar55._8_4_ | (uint)!bVar52 * local_2370._8_4_;
        bVar52 = SUB81(uVar53 >> 3,0);
        local_3780._12_4_ = (uint)bVar52 * auVar55._12_4_ | (uint)!bVar52 * local_2370._12_4_;
        auVar55 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar57);
        local_3770._0_4_ =
             (uint)(bVar36 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar36 & 1) * -0x800000;
        bVar52 = (bool)((byte)(uVar53 >> 1) & 1);
        local_3770._4_4_ = (uint)bVar52 * auVar55._4_4_ | (uint)!bVar52 * -0x800000;
        bVar52 = (bool)((byte)(uVar53 >> 2) & 1);
        local_3770._8_4_ = (uint)bVar52 * auVar55._8_4_ | (uint)!bVar52 * -0x800000;
        bVar52 = SUB81(uVar53 >> 3,0);
        local_3770._12_4_ = (uint)bVar52 * auVar55._12_4_ | (uint)!bVar52 * -0x800000;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar40 = 3;
        }
        else {
          uVar40 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
        }
        local_3938 = ray + 0x80;
        uVar50 = (ushort)uVar53 ^ 0xf;
        puVar44 = local_34f0;
        local_3500 = 0xfffffffffffffff8;
        pauVar46 = (undefined1 (*) [16])local_2350;
        local_34f8 = (local_3890->root).ptr;
        local_2360 = local_3780;
        auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar145 = ZEXT1664(auVar55);
        auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar146 = ZEXT1664(auVar55);
        auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar147 = ZEXT1664(auVar55);
        local_3888 = This;
        local_39e0 = ray;
        local_39d8 = context;
        local_3930 = uVar40;
        do {
          pauVar46 = pauVar46 + -1;
          root.ptr = puVar44[-1];
          puVar44 = puVar44 + -1;
          if (root.ptr == 0xfffffffffffffff8) {
LAB_0082bcab:
            iVar33 = 3;
          }
          else {
            local_3980 = *pauVar46;
            uVar53 = vcmpps_avx512vl(local_3980,local_3770,1);
            if ((char)uVar53 == '\0') {
LAB_0082bce0:
              iVar33 = 2;
            }
            else {
              uVar47 = (undefined4)uVar53;
              iVar33 = 0;
              if ((uint)POPCOUNT(uVar47) <= uVar40) {
                local_3970 = in_ZMM10._0_16_;
                local_3960 = in_ZMM27._0_16_;
                local_3950 = in_ZMM29._0_16_;
                local_39a0 = pauVar46;
                local_3998 = puVar44;
                do {
                  k = 0;
                  for (uVar40 = uVar53; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000
                      ) {
                    k = k + 1;
                  }
                  bVar52 = occluded1(local_3888,local_3890,root,k,&local_39f1,local_39e0,
                                     (TravRayK<4,_true> *)&local_3840.field_0,context);
                  bVar36 = (byte)(1 << ((uint)k & 0x1f));
                  if (!bVar52) {
                    bVar36 = 0;
                  }
                  bVar36 = (byte)uVar50 | bVar36;
                  uVar50 = (ushort)bVar36;
                  uVar53 = uVar53 - 1 & uVar53;
                  context = local_39d8;
                } while (uVar53 != 0);
                uVar50 = (ushort)bVar36;
                if (bVar36 == 0xf) {
                  iVar33 = 3;
                }
                else {
                  auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  local_3770._0_4_ =
                       (uint)(bVar36 & 1) * auVar55._0_4_ |
                       (uint)!(bool)(bVar36 & 1) * local_3770._0_4_;
                  bVar52 = (bool)(bVar36 >> 1 & 1);
                  local_3770._4_4_ = (uint)bVar52 * auVar55._4_4_ | (uint)!bVar52 * local_3770._4_4_
                  ;
                  bVar52 = (bool)(bVar36 >> 2 & 1);
                  local_3770._8_4_ = (uint)bVar52 * auVar55._8_4_ | (uint)!bVar52 * local_3770._8_4_
                  ;
                  bVar52 = (bool)(bVar36 >> 3 & 1);
                  local_3770._12_4_ =
                       (uint)bVar52 * auVar55._12_4_ | (uint)!bVar52 * local_3770._12_4_;
                  iVar33 = 2;
                }
                auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar143 = ZEXT1664(auVar55);
                auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar144 = ZEXT1664(auVar55);
                auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar145 = ZEXT1664(auVar55);
                auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar146 = ZEXT1664(auVar55);
                auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar147 = ZEXT1664(auVar55);
                in_ZMM30 = ZEXT1664(in_ZMM30._0_16_);
                in_ZMM29 = ZEXT1664(local_3950);
                in_ZMM27 = ZEXT1664(local_3960);
                in_ZMM10 = ZEXT1664(local_3970);
                uVar40 = local_3930;
                puVar44 = local_3998;
                pauVar46 = local_39a0;
              }
              auVar131 = ZEXT1664(local_3980);
              if (uVar40 < (uint)POPCOUNT(uVar47)) {
                do {
                  if ((root.ptr & 8) != 0) {
                    if (root.ptr == 0xfffffffffffffff8) goto LAB_0082bcab;
                    uVar16 = vcmpps_avx512vl(auVar131._0_16_,local_3770,9);
                    if ((char)uVar16 != '\0') {
                      bVar36 = (byte)(uVar50 & 0xff0f);
                      local_3880 = (ulong)((uint)root.ptr & 0xf) - 8;
                      if (local_3880 != 0) {
                        uVar53 = root.ptr & 0xfffffffffffffff0;
                        uVar31 = uVar50 & 0xff0f ^ 0xf;
                        lVar37 = 0;
                        local_39a0 = pauVar46;
                        local_3998 = puVar44;
                        do {
                          local_3878 = lVar37;
                          lVar37 = lVar37 * 0x90;
                          auVar55._8_8_ = 0;
                          auVar55._0_8_ = *(ulong *)(uVar53 + 0x40 + lVar37);
                          auVar57._8_8_ = 0;
                          auVar57._0_8_ = *(ulong *)(uVar53 + 0x48 + lVar37);
                          uVar41 = vpcmpub_avx512vl(auVar55,auVar57,2);
                          if ((char)uVar41 != '\0') {
                            lVar37 = lVar37 + uVar53;
                            uVar41 = uVar41 & 0xff;
                            local_3870 = lVar37;
                            do {
                              auVar56._8_8_ = 0;
                              auVar56._0_8_ = *(ulong *)(lVar37 + 0x40);
                              auVar101 = vpmovzxbd_avx2(auVar56);
                              auVar101 = vcvtdq2ps_avx(auVar101);
                              uVar47 = *(undefined4 *)(lVar37 + 0x7c);
                              auVar107._4_4_ = uVar47;
                              auVar107._0_4_ = uVar47;
                              auVar107._8_4_ = uVar47;
                              auVar107._12_4_ = uVar47;
                              auVar107._16_4_ = uVar47;
                              auVar107._20_4_ = uVar47;
                              auVar107._24_4_ = uVar47;
                              auVar107._28_4_ = uVar47;
                              uVar47 = *(undefined4 *)(lVar37 + 0x70);
                              auVar120._4_4_ = uVar47;
                              auVar120._0_4_ = uVar47;
                              auVar120._8_4_ = uVar47;
                              auVar120._12_4_ = uVar47;
                              auVar120._16_4_ = uVar47;
                              auVar120._20_4_ = uVar47;
                              auVar120._24_4_ = uVar47;
                              auVar120._28_4_ = uVar47;
                              auVar55 = vfmadd213ps_fma(auVar101,auVar107,auVar120);
                              local_3600 = ZEXT1632(auVar55);
                              auVar54._8_8_ = 0;
                              auVar54._0_8_ = *(ulong *)(lVar37 + 0x48);
                              auVar101 = vpmovzxbd_avx2(auVar54);
                              auVar101 = vcvtdq2ps_avx(auVar101);
                              auVar55 = vfmadd213ps_fma(auVar101,auVar107,auVar120);
                              _local_3760 = ZEXT1632(auVar55);
                              auVar4._8_8_ = 0;
                              auVar4._0_8_ = *(ulong *)(lVar37 + 0x50);
                              auVar101 = vpmovzxbd_avx2(auVar4);
                              uVar47 = *(undefined4 *)(lVar37 + 0x80);
                              auVar108._4_4_ = uVar47;
                              auVar108._0_4_ = uVar47;
                              auVar108._8_4_ = uVar47;
                              auVar108._12_4_ = uVar47;
                              auVar108._16_4_ = uVar47;
                              auVar108._20_4_ = uVar47;
                              auVar108._24_4_ = uVar47;
                              auVar108._28_4_ = uVar47;
                              auVar101 = vcvtdq2ps_avx(auVar101);
                              uVar47 = *(undefined4 *)(lVar37 + 0x74);
                              auVar121._4_4_ = uVar47;
                              auVar121._0_4_ = uVar47;
                              auVar121._8_4_ = uVar47;
                              auVar121._12_4_ = uVar47;
                              auVar121._16_4_ = uVar47;
                              auVar121._20_4_ = uVar47;
                              auVar121._24_4_ = uVar47;
                              auVar121._28_4_ = uVar47;
                              auVar55 = vfmadd213ps_fma(auVar101,auVar108,auVar121);
                              auVar101 = ZEXT1632(auVar55);
                              local_3920.valid = (int *)auVar101._0_8_;
                              local_3920.geometryUserPtr = (void *)auVar101._8_8_;
                              local_3920.context = (RTCRayQueryContext *)auVar101._16_8_;
                              local_3920.ray = (RTCRayN *)auVar101._24_8_;
                              auVar5._8_8_ = 0;
                              auVar5._0_8_ = *(ulong *)(lVar37 + 0x58);
                              auVar101 = vpmovzxbd_avx2(auVar5);
                              auVar101 = vcvtdq2ps_avx(auVar101);
                              auVar55 = vfmadd213ps_fma(auVar101,auVar108,auVar121);
                              local_38c0 = ZEXT1632(auVar55);
                              auVar6._8_8_ = 0;
                              auVar6._0_8_ = *(ulong *)(lVar37 + 0x60);
                              auVar101 = vpmovzxbd_avx2(auVar6);
                              uVar47 = *(undefined4 *)(lVar37 + 0x84);
                              auVar109._4_4_ = uVar47;
                              auVar109._0_4_ = uVar47;
                              auVar109._8_4_ = uVar47;
                              auVar109._12_4_ = uVar47;
                              auVar109._16_4_ = uVar47;
                              auVar109._20_4_ = uVar47;
                              auVar109._24_4_ = uVar47;
                              auVar109._28_4_ = uVar47;
                              uVar47 = *(undefined4 *)(lVar37 + 0x78);
                              auVar122._4_4_ = uVar47;
                              auVar122._0_4_ = uVar47;
                              auVar122._8_4_ = uVar47;
                              auVar122._12_4_ = uVar47;
                              auVar122._16_4_ = uVar47;
                              auVar122._20_4_ = uVar47;
                              auVar122._24_4_ = uVar47;
                              auVar122._28_4_ = uVar47;
                              auVar101 = vcvtdq2ps_avx(auVar101);
                              auVar55 = vfmadd213ps_fma(auVar101,auVar109,auVar122);
                              local_36a0 = ZEXT1632(auVar55);
                              auVar67._8_8_ = 0;
                              auVar67._0_8_ = *(ulong *)(lVar37 + 0x68);
                              auVar101 = vpmovzxbd_avx2(auVar67);
                              lVar35 = 0;
                              for (uVar34 = uVar41; (uVar34 & 1) == 0;
                                  uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                                lVar35 = lVar35 + 1;
                              }
                              auVar101 = vcvtdq2ps_avx(auVar101);
                              auVar55 = vfmadd213ps_fma(auVar101,auVar109,auVar122);
                              local_36c0 = ZEXT1632(auVar55);
                              uVar34 = (ulong)(uint)((int)lVar35 * 4);
                              uVar47 = *(undefined4 *)(local_3600 + uVar34);
                              auVar71._4_4_ = uVar47;
                              auVar71._0_4_ = uVar47;
                              auVar71._8_4_ = uVar47;
                              auVar71._12_4_ = uVar47;
                              auVar68._8_8_ = local_3840._8_8_;
                              auVar68._0_8_ = local_3840._0_8_;
                              auVar69._8_8_ = local_3840._24_8_;
                              auVar69._0_8_ = local_3840._16_8_;
                              auVar70._8_8_ = local_3840._40_8_;
                              auVar70._0_8_ = local_3840._32_8_;
                              auVar55 = vsubps_avx(auVar71,auVar68);
                              auVar62._0_4_ = (float)local_37e0._0_4_ * auVar55._0_4_;
                              auVar62._4_4_ = (float)local_37e0._4_4_ * auVar55._4_4_;
                              auVar62._8_4_ = fStack_37d8 * auVar55._8_4_;
                              auVar62._12_4_ = fStack_37d4 * auVar55._12_4_;
                              uVar47 = *(undefined4 *)((long)&local_3920.valid + uVar34);
                              auVar64._4_4_ = uVar47;
                              auVar64._0_4_ = uVar47;
                              auVar64._8_4_ = uVar47;
                              auVar64._12_4_ = uVar47;
                              auVar55 = vsubps_avx(auVar64,auVar69);
                              auVar65._0_4_ = (float)local_37d0._0_4_ * auVar55._0_4_;
                              auVar65._4_4_ = (float)local_37d0._4_4_ * auVar55._4_4_;
                              auVar65._8_4_ = fStack_37c8 * auVar55._8_4_;
                              auVar65._12_4_ = fStack_37c4 * auVar55._12_4_;
                              uVar47 = *(undefined4 *)(local_36a0 + uVar34);
                              auVar66._4_4_ = uVar47;
                              auVar66._0_4_ = uVar47;
                              auVar66._8_4_ = uVar47;
                              auVar66._12_4_ = uVar47;
                              auVar55 = vsubps_avx(auVar66,auVar70);
                              auVar76._0_4_ = local_37c0._0_4_ * auVar55._0_4_;
                              auVar76._4_4_ = local_37c0._4_4_ * auVar55._4_4_;
                              auVar76._8_4_ = local_37c0._8_4_ * auVar55._8_4_;
                              auVar76._12_4_ = local_37c0._12_4_ * auVar55._12_4_;
                              uVar47 = *(undefined4 *)(local_3760 + uVar34);
                              auVar77._4_4_ = uVar47;
                              auVar77._0_4_ = uVar47;
                              auVar77._8_4_ = uVar47;
                              auVar77._12_4_ = uVar47;
                              auVar55 = vsubps_avx(auVar77,auVar68);
                              auVar63._0_4_ = (float)local_37e0._0_4_ * auVar55._0_4_;
                              auVar63._4_4_ = (float)local_37e0._4_4_ * auVar55._4_4_;
                              auVar63._8_4_ = fStack_37d8 * auVar55._8_4_;
                              auVar63._12_4_ = fStack_37d4 * auVar55._12_4_;
                              uVar47 = *(undefined4 *)(local_38c0 + uVar34);
                              auVar60._4_4_ = uVar47;
                              auVar60._0_4_ = uVar47;
                              auVar60._8_4_ = uVar47;
                              auVar60._12_4_ = uVar47;
                              auVar55 = vsubps_avx(auVar60,auVar69);
                              auVar58._0_4_ = (float)local_37d0._0_4_ * auVar55._0_4_;
                              auVar58._4_4_ = (float)local_37d0._4_4_ * auVar55._4_4_;
                              auVar58._8_4_ = fStack_37c8 * auVar55._8_4_;
                              auVar58._12_4_ = fStack_37c4 * auVar55._12_4_;
                              uVar47 = *(undefined4 *)(local_36c0 + uVar34);
                              auVar61._4_4_ = uVar47;
                              auVar61._0_4_ = uVar47;
                              auVar61._8_4_ = uVar47;
                              auVar61._12_4_ = uVar47;
                              auVar55 = vsubps_avx(auVar61,auVar70);
                              auVar59._0_4_ = local_37c0._0_4_ * auVar55._0_4_;
                              auVar59._4_4_ = local_37c0._4_4_ * auVar55._4_4_;
                              auVar59._8_4_ = local_37c0._8_4_ * auVar55._8_4_;
                              auVar59._12_4_ = local_37c0._12_4_ * auVar55._12_4_;
                              auVar55 = vminps_avx(auVar62,auVar63);
                              auVar57 = vminps_avx(auVar65,auVar58);
                              auVar55 = vmaxps_avx(auVar55,auVar57);
                              auVar57 = vminps_avx(auVar76,auVar59);
                              auVar55 = vmaxps_avx(auVar55,auVar57);
                              auVar56 = vmulps_avx512vl(auVar55,auVar145._0_16_);
                              auVar55 = vmaxps_avx(auVar62,auVar63);
                              auVar57 = vmaxps_avx(auVar65,auVar58);
                              auVar57 = vminps_avx(auVar55,auVar57);
                              auVar55 = vmaxps_avx(auVar76,auVar59);
                              auVar55 = vminps_avx(auVar57,auVar55);
                              auVar57 = vmulps_avx512vl(auVar55,auVar146._0_16_);
                              auVar55 = vmaxps_avx(auVar56,local_3780);
                              auVar57 = vminps_avx(auVar57,local_3770);
                              uVar16 = vcmpps_avx512vl(auVar55,auVar57,2);
                              bVar36 = (byte)uVar31;
                              if ((bVar36 & (byte)uVar16) == 0) {
                                bVar52 = false;
                              }
                              else {
                                local_3868 = uVar41;
                                uVar7 = *(ushort *)(lVar37 + lVar35 * 8);
                                uVar8 = *(ushort *)(lVar37 + 2 + lVar35 * 8);
                                pGVar9 = (context->scene->geometries).items
                                         [*(uint *)(lVar37 + 0x88)].ptr;
                                lVar42 = *(long *)&pGVar9->field_0x58;
                                lVar10 = *(long *)&pGVar9[1].time_range.upper;
                                lVar35 = (ulong)*(uint *)(lVar37 + 4 + lVar35 * 8) *
                                         pGVar9[1].super_RefCount.refCounter.
                                         super___atomic_base<unsigned_long>._M_i;
                                uVar32 = uVar7 & 0x7fff;
                                local_39c4 = uVar8 & 0x7fff;
                                uVar51 = *(uint *)(lVar42 + 4 + lVar35);
                                uVar41 = (ulong)uVar51;
                                uVar34 = (ulong)(uVar51 * local_39c4 +
                                                *(int *)(lVar42 + lVar35) + uVar32);
                                p_Var11 = pGVar9[1].intersectionFilterN;
                                puVar1 = (undefined8 *)(lVar10 + (uVar34 + 1) * (long)p_Var11);
                                local_3600._16_8_ = *puVar1;
                                local_3600._24_8_ = puVar1[1];
                                lVar37 = uVar34 + uVar41;
                                puVar1 = (undefined8 *)(lVar10 + lVar37 * (long)p_Var11);
                                local_35d0 = *puVar1;
                                uStack_35c8 = puVar1[1];
                                lVar45 = uVar34 + uVar41 + 1;
                                puVar1 = (undefined8 *)(lVar10 + lVar45 * (long)p_Var11);
                                local_35e0 = *puVar1;
                                uStack_35d8 = puVar1[1];
                                uVar40 = (ulong)(-1 < (short)uVar7);
                                puVar1 = (undefined8 *)
                                         (lVar10 + (uVar34 + uVar40 + 1) * (long)p_Var11);
                                lVar38 = uVar40 + lVar45;
                                puVar2 = (undefined8 *)(lVar10 + lVar38 * (long)p_Var11);
                                local_35a0 = *puVar2;
                                uStack_3598 = puVar2[1];
                                if ((short)uVar8 < 0) {
                                  uVar41 = 0;
                                }
                                puVar2 = (undefined8 *)(lVar10 + (lVar37 + uVar41) * (long)p_Var11);
                                puVar3 = (undefined8 *)(lVar10 + (lVar45 + uVar41) * (long)p_Var11);
                                local_3560 = *puVar3;
                                uStack_3558 = puVar3[1];
                                puVar3 = (undefined8 *)(lVar10 + (uVar41 + lVar38) * (long)p_Var11);
                                local_3660 = vpbroadcastd_avx512vl();
                                local_3600._0_16_ =
                                     *(undefined1 (*) [16])(lVar10 + (long)p_Var11 * uVar34);
                                local_35c0 = local_3600._16_8_;
                                uStack_35b8 = local_3600._24_8_;
                                local_35b0 = *puVar1;
                                uStack_35a8 = puVar1[1];
                                local_3590 = local_35e0;
                                uStack_3588 = uStack_35d8;
                                local_3580 = local_35d0;
                                uStack_3578 = uStack_35c8;
                                local_3570 = local_35e0;
                                uStack_3568 = uStack_35d8;
                                local_3550 = *puVar2;
                                uStack_3548 = puVar2[1];
                                local_3540 = local_35e0;
                                uStack_3538 = uStack_35d8;
                                local_3530 = local_35a0;
                                uStack_3528 = uStack_3598;
                                local_3520 = *puVar3;
                                uStack_3518 = puVar3[1];
                                local_3510 = local_3560;
                                uStack_3508 = uStack_3558;
                                local_3670 = vpbroadcastd_avx512vl();
                                puVar39 = (uint *)&uStack_35c8;
                                uVar40 = 0;
                                pRVar43 = local_39e0;
                                context = local_39d8;
                                do {
                                  uVar51 = puVar39[-0xe];
                                  auVar79._4_4_ = uVar51;
                                  auVar79._0_4_ = uVar51;
                                  auVar79._8_4_ = uVar51;
                                  auVar79._12_4_ = uVar51;
                                  uVar51 = puVar39[-0xd];
                                  auVar80._4_4_ = uVar51;
                                  auVar80._0_4_ = uVar51;
                                  auVar80._8_4_ = uVar51;
                                  auVar80._12_4_ = uVar51;
                                  uVar51 = puVar39[-0xc];
                                  auVar124._4_4_ = uVar51;
                                  auVar124._0_4_ = uVar51;
                                  auVar124._8_4_ = uVar51;
                                  auVar124._12_4_ = uVar51;
                                  uVar51 = puVar39[-10];
                                  local_3950._4_4_ = uVar51;
                                  local_3950._0_4_ = uVar51;
                                  local_3950._8_4_ = uVar51;
                                  local_3950._12_4_ = uVar51;
                                  uVar51 = puVar39[-9];
                                  local_3960._4_4_ = uVar51;
                                  local_3960._0_4_ = uVar51;
                                  local_3960._8_4_ = uVar51;
                                  local_3960._12_4_ = uVar51;
                                  uVar51 = puVar39[-8];
                                  local_3970._4_4_ = (float)uVar51;
                                  local_3970._0_4_ = (float)uVar51;
                                  local_3970._8_4_ = (float)uVar51;
                                  local_3970._12_4_ = (float)uVar51;
                                  uVar51 = puVar39[-2];
                                  local_3980._4_4_ = uVar51;
                                  local_3980._0_4_ = uVar51;
                                  local_3980._8_4_ = uVar51;
                                  local_3980._12_4_ = uVar51;
                                  local_3610 = vbroadcastss_avx512vl(ZEXT416(puVar39[-1]));
                                  local_3620 = vbroadcastss_avx512vl(ZEXT416(*puVar39));
                                  local_36a0._0_16_ = local_3670;
                                  local_36c0._0_16_ = local_3660;
                                  auVar55 = *(undefined1 (*) [16])pRVar43;
                                  auVar57 = *(undefined1 (*) [16])(pRVar43 + 0x10);
                                  auVar56 = *(undefined1 (*) [16])(pRVar43 + 0x20);
                                  auVar54 = *(undefined1 (*) [16])(pRVar43 + 0x40);
                                  auVar126 = *(undefined1 (*) [16])(pRVar43 + 0x50);
                                  auVar127 = *(undefined1 (*) [16])(pRVar43 + 0x60);
                                  auVar4 = vsubps_avx(auVar79,auVar55);
                                  auVar5 = vsubps_avx(auVar80,auVar57);
                                  auVar6 = vsubps_avx(auVar124,auVar56);
                                  auVar67 = vsubps_avx(local_3950,auVar55);
                                  auVar68 = vsubps_avx(local_3960,auVar57);
                                  auVar69 = vsubps_avx(local_3970,auVar56);
                                  auVar55 = vsubps_avx(local_3980,auVar55);
                                  auVar58 = vsubps_avx512vl(local_3610,auVar57);
                                  auVar59 = vsubps_avx512vl(local_3620,auVar56);
                                  auVar57 = vsubps_avx(auVar55,auVar4);
                                  auVar60 = vsubps_avx512vl(auVar58,auVar5);
                                  auVar61 = vsubps_avx512vl(auVar59,auVar6);
                                  auVar56 = vsubps_avx(auVar4,auVar67);
                                  auVar70 = vsubps_avx(auVar5,auVar68);
                                  auVar71 = vsubps_avx(auVar6,auVar69);
                                  auVar62 = vaddps_avx512vl(auVar55,auVar4);
                                  auVar63 = vaddps_avx512vl(auVar58,auVar5);
                                  auVar64 = vaddps_avx512vl(auVar59,auVar6);
                                  auVar65 = vmulps_avx512vl(auVar63,auVar61);
                                  auVar65 = vfmsub231ps_avx512vl(auVar65,auVar60,auVar64);
                                  auVar64 = vmulps_avx512vl(auVar64,auVar57);
                                  auVar64 = vfmsub231ps_avx512vl(auVar64,auVar61,auVar62);
                                  auVar62 = vmulps_avx512vl(auVar62,auVar60);
                                  auVar62 = vfmsub231ps_avx512vl(auVar62,auVar57,auVar63);
                                  auVar62 = vmulps_avx512vl(auVar62,auVar127);
                                  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar126,auVar64);
                                  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar54,auVar65);
                                  auVar63 = vaddps_avx512vl(auVar4,auVar67);
                                  auVar64 = vaddps_avx512vl(auVar5,auVar68);
                                  auVar65 = vaddps_avx512vl(auVar6,auVar69);
                                  auVar66 = vmulps_avx512vl(auVar64,auVar71);
                                  auVar66 = vfmsub231ps_avx512vl(auVar66,auVar70,auVar65);
                                  auVar65 = vmulps_avx512vl(auVar65,auVar56);
                                  auVar65 = vfmsub231ps_avx512vl(auVar65,auVar71,auVar63);
                                  auVar63 = vmulps_avx512vl(auVar63,auVar70);
                                  auVar63 = vfmsub231ps_avx512vl(auVar63,auVar56,auVar64);
                                  auVar63 = vmulps_avx512vl(auVar63,auVar127);
                                  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar126,auVar65);
                                  auVar64 = vsubps_avx512vl(auVar67,auVar55);
                                  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar54,auVar66);
                                  auVar65 = vsubps_avx512vl(auVar68,auVar58);
                                  auVar132._0_4_ = auVar67._0_4_ + auVar55._0_4_;
                                  auVar132._4_4_ = auVar67._4_4_ + auVar55._4_4_;
                                  auVar132._8_4_ = auVar67._8_4_ + auVar55._8_4_;
                                  auVar132._12_4_ = auVar67._12_4_ + auVar55._12_4_;
                                  auVar66 = vsubps_avx512vl(auVar69,auVar59);
                                  auVar55 = vaddps_avx512vl(auVar68,auVar58);
                                  auVar67 = vaddps_avx512vl(auVar69,auVar59);
                                  auVar68 = vmulps_avx512vl(auVar55,auVar66);
                                  auVar68 = vfmsub231ps_avx512vl(auVar68,auVar65,auVar67);
                                  auVar67 = vmulps_avx512vl(auVar67,auVar64);
                                  auVar67 = vfmsub231ps_avx512vl(auVar67,auVar66,auVar132);
                                  auVar69 = vmulps_avx512vl(auVar132,auVar65);
                                  auVar55 = vfmsub231ps_avx512vl(auVar69,auVar64,auVar55);
                                  auVar133._0_4_ = auVar55._0_4_ * auVar127._0_4_;
                                  auVar133._4_4_ = auVar55._4_4_ * auVar127._4_4_;
                                  auVar133._8_4_ = auVar55._8_4_ * auVar127._8_4_;
                                  auVar133._12_4_ = auVar55._12_4_ * auVar127._12_4_;
                                  auVar55 = vfmadd231ps_fma(auVar133,auVar126,auVar67);
                                  auVar67 = vfmadd231ps_fma(auVar55,auVar54,auVar68);
                                  auVar55 = vaddps_avx512vl(auVar62,auVar63);
                                  local_3a10._0_4_ = auVar67._0_4_ + auVar55._0_4_;
                                  local_3a10._4_4_ = auVar67._4_4_ + auVar55._4_4_;
                                  local_3a10._8_4_ = auVar67._8_4_ + auVar55._8_4_;
                                  local_3a10._12_4_ = auVar67._12_4_ + auVar55._12_4_;
                                  auVar58 = auVar143._0_16_;
                                  auVar55 = vandps_avx512vl(local_3a10,auVar58);
                                  auVar78._8_4_ = 0x34000000;
                                  auVar78._0_8_ = 0x3400000034000000;
                                  auVar78._12_4_ = 0x34000000;
                                  auVar68 = vmulps_avx512vl(auVar55,auVar78);
                                  auVar55 = vminps_avx512vl(auVar62,auVar63);
                                  auVar55 = vminps_avx(auVar55,auVar67);
                                  auVar69 = vxorps_avx512vl(auVar68,auVar147._0_16_);
                                  uVar16 = vcmpps_avx512vl(auVar55,auVar69,5);
                                  auVar55 = vmaxps_avx512vl(auVar62,auVar63);
                                  auVar55 = vmaxps_avx(auVar55,auVar67);
                                  local_3630 = puVar39[-6];
                                  uStack_362c = local_3630;
                                  uStack_3628 = local_3630;
                                  uStack_3624 = local_3630;
                                  uVar18 = vcmpps_avx512vl(auVar55,auVar68,2);
                                  local_3640 = puVar39[-5];
                                  uStack_363c = local_3640;
                                  uStack_3638 = local_3640;
                                  uStack_3634 = local_3640;
                                  local_3650 = puVar39[-4];
                                  uStack_364c = local_3650;
                                  uStack_3648 = local_3650;
                                  uStack_3644 = local_3650;
                                  bVar49 = (byte)uVar31;
                                  bVar48 = ((byte)uVar16 | (byte)uVar18) & 0xf & bVar49;
                                  uVar51 = (uint)bVar48;
                                  if (bVar48 == 0) {
LAB_0082b8ba:
                                    auVar74 = local_39c0;
                                    auVar130 = in_ZMM10._0_16_;
                                    auVar62 = in_ZMM30._0_16_;
                                    auVar73 = local_3990;
                                    auVar63 = in_ZMM29._0_16_;
                                    auVar72 = local_39f0;
                                    local_3a10 = in_ZMM27._0_16_;
                                  }
                                  else {
                                    auVar134._0_4_ = auVar70._0_4_ * auVar61._0_4_;
                                    auVar134._4_4_ = auVar70._4_4_ * auVar61._4_4_;
                                    auVar134._8_4_ = auVar70._8_4_ * auVar61._8_4_;
                                    auVar134._12_4_ = auVar70._12_4_ * auVar61._12_4_;
                                    auVar138._0_4_ = auVar71._0_4_ * auVar57._0_4_;
                                    auVar138._4_4_ = auVar71._4_4_ * auVar57._4_4_;
                                    auVar138._8_4_ = auVar71._8_4_ * auVar57._8_4_;
                                    auVar138._12_4_ = auVar71._12_4_ * auVar57._12_4_;
                                    auVar141._0_4_ = auVar56._0_4_ * auVar60._0_4_;
                                    auVar141._4_4_ = auVar56._4_4_ * auVar60._4_4_;
                                    auVar141._8_4_ = auVar56._8_4_ * auVar60._8_4_;
                                    auVar141._12_4_ = auVar56._12_4_ * auVar60._12_4_;
                                    auVar68 = vmulps_avx512vl(auVar65,auVar71);
                                    auVar69 = vmulps_avx512vl(auVar56,auVar66);
                                    auVar59 = vmulps_avx512vl(auVar64,auVar70);
                                    auVar55 = vfmsub213ps_fma(auVar60,auVar71,auVar134);
                                    auVar67 = vfmsub213ps_fma(auVar61,auVar56,auVar138);
                                    auVar57 = vfmsub213ps_fma(auVar57,auVar70,auVar141);
                                    auVar70 = vfmsub213ps_avx512vl(auVar66,auVar70,auVar68);
                                    auVar71 = vfmsub213ps_avx512vl(auVar64,auVar71,auVar69);
                                    auVar56 = vfmsub213ps_avx512vl(auVar65,auVar56,auVar59);
                                    auVar60 = vandps_avx512vl(auVar134,auVar58);
                                    auVar68 = vandps_avx512vl(auVar68,auVar58);
                                    uVar41 = vcmpps_avx512vl(auVar60,auVar68,1);
                                    auVar68 = vandps_avx512vl(auVar138,auVar58);
                                    auVar69 = vandps_avx512vl(auVar69,auVar58);
                                    uVar34 = vcmpps_avx512vl(auVar68,auVar69,1);
                                    auVar68 = vandps_avx512vl(auVar141,auVar58);
                                    auVar69 = vandps_avx512vl(auVar59,auVar58);
                                    uVar17 = vcmpps_avx512vl(auVar68,auVar69,1);
                                    bVar52 = (bool)((byte)uVar41 & 1);
                                    auVar72._0_4_ =
                                         (uint)bVar52 * auVar55._0_4_ |
                                         (uint)!bVar52 * auVar70._0_4_;
                                    bVar52 = (bool)((byte)(uVar41 >> 1) & 1);
                                    auVar72._4_4_ =
                                         (uint)bVar52 * auVar55._4_4_ |
                                         (uint)!bVar52 * auVar70._4_4_;
                                    bVar52 = (bool)((byte)(uVar41 >> 2) & 1);
                                    auVar72._8_4_ =
                                         (uint)bVar52 * auVar55._8_4_ |
                                         (uint)!bVar52 * auVar70._8_4_;
                                    bVar52 = (bool)((byte)(uVar41 >> 3) & 1);
                                    auVar72._12_4_ =
                                         (uint)bVar52 * auVar55._12_4_ |
                                         (uint)!bVar52 * auVar70._12_4_;
                                    bVar52 = (bool)((byte)uVar34 & 1);
                                    auVar73._0_4_ =
                                         (uint)bVar52 * auVar67._0_4_ |
                                         (uint)!bVar52 * auVar71._0_4_;
                                    bVar52 = (bool)((byte)(uVar34 >> 1) & 1);
                                    auVar73._4_4_ =
                                         (uint)bVar52 * auVar67._4_4_ |
                                         (uint)!bVar52 * auVar71._4_4_;
                                    bVar52 = (bool)((byte)(uVar34 >> 2) & 1);
                                    auVar73._8_4_ =
                                         (uint)bVar52 * auVar67._8_4_ |
                                         (uint)!bVar52 * auVar71._8_4_;
                                    bVar52 = (bool)((byte)(uVar34 >> 3) & 1);
                                    auVar73._12_4_ =
                                         (uint)bVar52 * auVar67._12_4_ |
                                         (uint)!bVar52 * auVar71._12_4_;
                                    bVar52 = (bool)((byte)uVar17 & 1);
                                    auVar74._0_4_ =
                                         (uint)bVar52 * auVar57._0_4_ |
                                         (uint)!bVar52 * auVar56._0_4_;
                                    bVar52 = (bool)((byte)(uVar17 >> 1) & 1);
                                    auVar74._4_4_ =
                                         (uint)bVar52 * auVar57._4_4_ |
                                         (uint)!bVar52 * auVar56._4_4_;
                                    bVar52 = (bool)((byte)(uVar17 >> 2) & 1);
                                    auVar74._8_4_ =
                                         (uint)bVar52 * auVar57._8_4_ |
                                         (uint)!bVar52 * auVar56._8_4_;
                                    bVar52 = (bool)((byte)(uVar17 >> 3) & 1);
                                    auVar74._12_4_ =
                                         (uint)bVar52 * auVar57._12_4_ |
                                         (uint)!bVar52 * auVar56._12_4_;
                                    auVar55 = vmulps_avx512vl(auVar127,auVar74);
                                    auVar55 = vfmadd213ps_avx512vl(auVar126,auVar73,auVar55);
                                    auVar55 = vfmadd213ps_avx512vl(auVar54,auVar72,auVar55);
                                    auVar112._0_4_ = auVar55._0_4_ + auVar55._0_4_;
                                    auVar112._4_4_ = auVar55._4_4_ + auVar55._4_4_;
                                    auVar112._8_4_ = auVar55._8_4_ + auVar55._8_4_;
                                    auVar112._12_4_ = auVar55._12_4_ + auVar55._12_4_;
                                    auVar55 = vmulps_avx512vl(auVar6,auVar74);
                                    auVar55 = vfmadd213ps_avx512vl(auVar5,auVar73,auVar55);
                                    auVar57 = vfmadd213ps_avx512vl(auVar4,auVar72,auVar55);
                                    auVar55 = vrcp14ps_avx512vl(auVar112);
                                    auVar56 = vxorps_avx512vl(auVar112,auVar147._0_16_);
                                    auVar20._8_4_ = 0x3f800000;
                                    auVar20._0_8_ = &DAT_3f8000003f800000;
                                    auVar20._12_4_ = 0x3f800000;
                                    auVar54 = vfnmadd213ps_avx512vl(auVar55,auVar112,auVar20);
                                    auVar55 = vfmadd132ps_fma(auVar54,auVar55,auVar55);
                                    auVar130._0_4_ = (auVar57._0_4_ + auVar57._0_4_) * auVar55._0_4_
                                    ;
                                    auVar130._4_4_ = (auVar57._4_4_ + auVar57._4_4_) * auVar55._4_4_
                                    ;
                                    auVar130._8_4_ = (auVar57._8_4_ + auVar57._8_4_) * auVar55._8_4_
                                    ;
                                    auVar130._12_4_ =
                                         (auVar57._12_4_ + auVar57._12_4_) * auVar55._12_4_;
                                    uVar16 = vcmpps_avx512vl(auVar130,*(undefined1 (*) [16])
                                                                       (pRVar43 + 0x80),2);
                                    uVar18 = vcmpps_avx512vl(auVar130,*(undefined1 (*) [16])
                                                                       (pRVar43 + 0x30),0xd);
                                    uVar19 = vcmpps_avx512vl(auVar112,auVar56,4);
                                    bVar48 = bVar48 & (byte)uVar16 & (byte)uVar18 & (byte)uVar19;
                                    uVar51 = (uint)bVar48;
                                    if (bVar48 == 0) goto LAB_0082b8ba;
                                  }
                                  in_ZMM10 = ZEXT1664(auVar130);
                                  bVar48 = (byte)uVar51;
                                  uVar41 = uVar40;
                                  if (bVar48 != 0) {
                                    auVar55 = vcvtsi2ss_avx512f(auVar58,*(ushort *)
                                                                         (lVar42 + 8 + lVar35) - 1);
                                    auVar103._4_12_ = ZEXT812(0) << 0x20;
                                    auVar103._0_4_ = auVar55._0_4_;
                                    auVar57 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar103);
                                    auVar55 = vfnmadd213ss_fma(auVar55,auVar57,
                                                               SUB6416(ZEXT464(0x40000000),0));
                                    fVar88 = auVar57._0_4_ * auVar55._0_4_;
                                    auVar55 = vcvtsi2ss_avx512f(auVar58,*(ushort *)
                                                                         (lVar42 + 10 + lVar35) - 1)
                                    ;
                                    auVar113._4_12_ = ZEXT812(0) << 0x20;
                                    auVar113._0_4_ = auVar55._0_4_;
                                    auVar57 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar113);
                                    auVar55 = vfnmadd213ss_fma(auVar55,auVar57,
                                                               SUB6416(ZEXT464(0x40000000),0));
                                    fVar15 = auVar57._0_4_ * auVar55._0_4_;
                                    auVar55 = vcvtsi2ss_avx512f(auVar58,((uint)uVar40 & 1) + uVar32)
                                    ;
                                    fVar110 = auVar55._0_4_;
                                    auVar114._0_4_ = fVar110 * local_3a10._0_4_;
                                    auVar114._4_4_ = fVar110 * local_3a10._4_4_;
                                    auVar114._8_4_ = fVar110 * local_3a10._8_4_;
                                    auVar114._12_4_ = fVar110 * local_3a10._12_4_;
                                    auVar55 = vaddps_avx512vl(auVar62,auVar114);
                                    auVar95._4_4_ = fVar88;
                                    auVar95._0_4_ = fVar88;
                                    auVar95._8_4_ = fVar88;
                                    auVar95._12_4_ = fVar88;
                                    auVar55 = vmulps_avx512vl(auVar55,auVar95);
                                    local_39f0._0_4_ =
                                         (uint)(bVar48 & 1) * auVar55._0_4_ |
                                         (uint)!(bool)(bVar48 & 1) * auVar62._0_4_;
                                    bVar52 = (bool)((byte)(uVar51 >> 1) & 1);
                                    local_39f0._4_4_ =
                                         (uint)bVar52 * auVar55._4_4_ |
                                         (uint)!bVar52 * auVar62._4_4_;
                                    bVar52 = (bool)((byte)(uVar51 >> 2) & 1);
                                    local_39f0._8_4_ =
                                         (uint)bVar52 * auVar55._8_4_ |
                                         (uint)!bVar52 * auVar62._8_4_;
                                    local_39f0._12_4_ =
                                         (uVar51 >> 3) * auVar55._12_4_ |
                                         (uint)!SUB41(uVar51 >> 3,0) * auVar62._12_4_;
                                    auVar55 = vcvtsi2ss_avx512f(auVar58,((uint)(uVar40 >> 1) &
                                                                        0x7fffffff) + local_39c4);
                                    fVar88 = auVar55._0_4_;
                                    auVar96._0_4_ = fVar88 * local_3a10._0_4_;
                                    auVar96._4_4_ = fVar88 * local_3a10._4_4_;
                                    auVar96._8_4_ = fVar88 * local_3a10._8_4_;
                                    auVar96._12_4_ = fVar88 * local_3a10._12_4_;
                                    auVar55 = vaddps_avx512vl(auVar63,auVar96);
                                    auVar104._4_4_ = fVar15;
                                    auVar104._0_4_ = fVar15;
                                    auVar104._8_4_ = fVar15;
                                    auVar104._12_4_ = fVar15;
                                    auVar55 = vmulps_avx512vl(auVar55,auVar104);
                                    auVar75._0_4_ =
                                         (uint)(bVar48 & 1) * auVar55._0_4_ |
                                         (uint)!(bool)(bVar48 & 1) * auVar63._0_4_;
                                    bVar52 = (bool)((byte)(uVar51 >> 1) & 1);
                                    auVar75._4_4_ =
                                         (uint)bVar52 * auVar55._4_4_ |
                                         (uint)!bVar52 * auVar63._4_4_;
                                    bVar52 = (bool)((byte)(uVar51 >> 2) & 1);
                                    auVar75._8_4_ =
                                         (uint)bVar52 * auVar55._8_4_ |
                                         (uint)!bVar52 * auVar63._8_4_;
                                    auVar75._12_4_ =
                                         (uVar51 >> 3) * auVar55._12_4_ |
                                         (uint)!SUB41(uVar51 >> 3,0) * auVar63._12_4_;
                                    pGVar9 = (context->scene->geometries).items
                                             [*(uint *)(local_36a0 + uVar40 * 4)].ptr;
                                    uVar51 = pGVar9->mask;
                                    auVar97._4_4_ = uVar51;
                                    auVar97._0_4_ = uVar51;
                                    auVar97._8_4_ = uVar51;
                                    auVar97._12_4_ = uVar51;
                                    uVar16 = vptestmd_avx512vl(auVar97,*(undefined1 (*) [16])
                                                                        (pRVar43 + 0x90));
                                    bVar30 = (byte)uVar16 & 0xf & bVar48;
                                    uVar41 = (ulong)bVar30;
                                    auVar63 = auVar75;
                                    auVar62 = local_39f0;
                                    if (bVar30 != 0) {
                                      local_3990._0_8_ = uVar40;
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar55 = vandps_avx512vl(local_3a10,auVar58);
                                        auVar23._8_4_ = 0x219392ef;
                                        auVar23._0_8_ = 0x219392ef219392ef;
                                        auVar23._12_4_ = 0x219392ef;
                                        uVar40 = vcmpps_avx512vl(auVar55,auVar23,5);
                                        auVar57 = vrcp14ps_avx512vl(local_3a10);
                                        auVar118._8_4_ = 0x3f800000;
                                        auVar118._0_8_ = &DAT_3f8000003f800000;
                                        auVar118._12_4_ = 0x3f800000;
                                        auVar55 = vfnmadd213ps_fma(auVar57,local_3a10,auVar118);
                                        auVar55 = vfmadd132ps_avx512vl(auVar55,auVar57,auVar57);
                                        auVar82._4_4_ =
                                             (uint)((byte)(uVar40 >> 1) & 1) * auVar55._4_4_;
                                        auVar82._0_4_ = (uint)((byte)uVar40 & 1) * auVar55._0_4_;
                                        auVar82._8_4_ =
                                             (uint)((byte)(uVar40 >> 2) & 1) * auVar55._8_4_;
                                        auVar82._12_4_ =
                                             (uint)((byte)(uVar40 >> 3) & 1) * auVar55._12_4_;
                                        auVar55 = vmulps_avx512vl(local_39f0,auVar82);
                                        local_3730 = vminps_avx(auVar55,auVar118);
                                        auVar55 = vmulps_avx512vl(auVar75,auVar82);
                                        local_3720 = vminps_avx(auVar55,auVar118);
                                        local_3700 = vpbroadcastd_avx512vl();
                                        local_3710 = vpbroadcastd_avx512vl();
                                        auStack_3750 = auVar73;
                                        local_3760 = (RTCHitN  [16])auVar72;
                                        local_3740 = auVar74;
                                        vpcmpeqd_avx2(ZEXT1632(local_3730),ZEXT1632(local_3730));
                                        uStack_36ec = context->user->instID[0];
                                        local_36f0 = uStack_36ec;
                                        uStack_36e8 = uStack_36ec;
                                        uStack_36e4 = uStack_36ec;
                                        uStack_36e0 = context->user->instPrimID[0];
                                        uStack_36dc = uStack_36e0;
                                        uStack_36d8 = uStack_36e0;
                                        uStack_36d4 = uStack_36e0;
                                        local_39c0 = *(undefined1 (*) [16])(pRVar43 + 0x80);
                                        auVar55 = vblendmps_avx512vl(local_39c0,auVar130);
                                        bVar52 = (bool)(bVar30 >> 1 & 1);
                                        bVar12 = (bool)(bVar30 >> 2 & 1);
                                        *(uint *)(pRVar43 + 0x80) =
                                             (uint)(bVar30 & 1) * auVar55._0_4_ |
                                             !(bool)(bVar30 & 1) * uStack_36e0;
                                        *(uint *)(pRVar43 + 0x84) =
                                             (uint)bVar52 * auVar55._4_4_ | !bVar52 * uStack_36e0;
                                        *(uint *)(pRVar43 + 0x88) =
                                             (uint)bVar12 * auVar55._8_4_ | !bVar12 * uStack_36e0;
                                        *(uint *)(pRVar43 + 0x8c) =
                                             (uint)(bVar30 >> 3) * auVar55._12_4_ |
                                             !(bool)(bVar30 >> 3) * uStack_36e0;
                                        auVar55 = vpmovm2d_avx512vl(uVar41);
                                        local_38c0._0_16_ = auVar55;
                                        local_3920.geometryUserPtr = pGVar9->userPtr;
                                        local_3920.valid = (int *)local_38c0;
                                        local_3920.context = context->user;
                                        local_3920.ray = (RTCRayN *)pRVar43;
                                        local_3920.hit = local_3760;
                                        local_3920.N = 4;
                                        local_38d0 = auVar73;
                                        local_38e0 = auVar75;
                                        local_3850 = auVar74;
                                        local_3860 = auVar72;
                                        local_38f0 = auVar130;
                                        local_39d0 = lVar42;
                                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          local_39a8 = lVar35;
                                          (*pGVar9->occlusionFilterN)(&local_3920);
                                          in_ZMM10 = ZEXT1664(local_38f0);
                                          auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar147 = ZEXT1664(auVar55);
                                          auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                          auVar146 = ZEXT1664(auVar55);
                                          auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                          auVar145 = ZEXT1664(auVar55);
                                          auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar144 = ZEXT1664(auVar55);
                                          auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar143 = ZEXT1664(auVar55);
                                          pRVar43 = local_39e0;
                                          lVar35 = local_39a8;
                                          context = local_39d8;
                                        }
                                        uVar41 = vptestmd_avx512vl(local_38c0._0_16_,
                                                                   local_38c0._0_16_);
                                        uVar41 = uVar41 & 0xf;
                                        if ((char)uVar41 != '\0') {
                                          p_Var11 = context->args->filter;
                                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                                            (*p_Var11)(&local_3920);
                                            in_ZMM10 = ZEXT1664(local_38f0);
                                            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar147 = ZEXT1664(auVar55);
                                            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                            auVar146 = ZEXT1664(auVar55);
                                            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                            auVar145 = ZEXT1664(auVar55);
                                            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar144 = ZEXT1664(auVar55);
                                            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                            auVar143 = ZEXT1664(auVar55);
                                            pRVar43 = local_39e0;
                                            context = local_39d8;
                                          }
                                          uVar41 = vptestmd_avx512vl(local_38c0._0_16_,
                                                                     local_38c0._0_16_);
                                          uVar41 = uVar41 & 0xf;
                                          auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar52 = (bool)((byte)uVar41 & 1);
                                          auVar83._0_4_ =
                                               (uint)bVar52 * auVar55._0_4_ |
                                               (uint)!bVar52 * *(int *)(local_3920.ray + 0x80);
                                          bVar52 = (bool)((byte)(uVar41 >> 1) & 1);
                                          auVar83._4_4_ =
                                               (uint)bVar52 * auVar55._4_4_ |
                                               (uint)!bVar52 * *(int *)(local_3920.ray + 0x84);
                                          bVar52 = (bool)((byte)(uVar41 >> 2) & 1);
                                          auVar83._8_4_ =
                                               (uint)bVar52 * auVar55._8_4_ |
                                               (uint)!bVar52 * *(int *)(local_3920.ray + 0x88);
                                          bVar52 = SUB81(uVar41 >> 3,0);
                                          auVar83._12_4_ =
                                               (uint)bVar52 * auVar55._12_4_ |
                                               (uint)!bVar52 * *(int *)(local_3920.ray + 0x8c);
                                          *(undefined1 (*) [16])(local_3920.ray + 0x80) = auVar83;
                                        }
                                        bVar52 = (bool)((byte)uVar41 & 1);
                                        auVar86._0_4_ =
                                             (uint)bVar52 * *(int *)local_3938 |
                                             (uint)!bVar52 * local_39c0._0_4_;
                                        bVar52 = (bool)((byte)(uVar41 >> 1) & 1);
                                        auVar86._4_4_ =
                                             (uint)bVar52 * *(int *)(local_3938 + 4) |
                                             (uint)!bVar52 * local_39c0._4_4_;
                                        bVar52 = (bool)((byte)(uVar41 >> 2) & 1);
                                        auVar86._8_4_ =
                                             (uint)bVar52 * *(int *)(local_3938 + 8) |
                                             (uint)!bVar52 * local_39c0._8_4_;
                                        bVar52 = SUB81(uVar41 >> 3,0);
                                        auVar86._12_4_ =
                                             (uint)bVar52 * *(int *)(local_3938 + 0xc) |
                                             (uint)!bVar52 * local_39c0._12_4_;
                                        *(undefined1 (*) [16])local_3938 = auVar86;
                                        lVar42 = local_39d0;
                                        auVar72 = local_3860;
                                        auVar74 = local_3850;
                                        auVar63 = local_38e0;
                                        auVar73 = local_38d0;
                                        auVar62 = local_39f0;
                                        uVar40 = local_3990._0_8_;
                                      }
                                      local_3990._0_8_ = uVar40;
                                      uVar31 = (ushort)(((byte)uVar41 ^ 0xf) & bVar49);
                                      uVar40 = local_3990._0_8_;
                                    }
                                    bVar49 = (bVar48 ^ 0xf) & bVar49;
                                    uVar41 = uVar40;
                                  }
                                  if (bVar49 == 0) {
                                    in_ZMM30 = ZEXT1664(auVar62);
                                    in_ZMM29 = ZEXT1664(auVar63);
                                    in_ZMM27 = ZEXT1664(local_3a10);
                                    local_39f0 = auVar72;
                                    local_39c0 = auVar74;
                                  }
                                  else {
                                    local_38f0 = in_ZMM10._0_16_;
                                    local_38e0 = auVar63;
                                    local_38d0 = auVar73;
                                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar55 = *(undefined1 (*) [16])pRVar43;
                                    auVar57 = *(undefined1 (*) [16])(pRVar43 + 0x10);
                                    auVar56 = *(undefined1 (*) [16])(pRVar43 + 0x20);
                                    auVar54 = *(undefined1 (*) [16])(pRVar43 + 0x40);
                                    auVar126 = *(undefined1 (*) [16])(pRVar43 + 0x50);
                                    auVar127 = *(undefined1 (*) [16])(pRVar43 + 0x60);
                                    auVar29._4_4_ = uStack_362c;
                                    auVar29._0_4_ = local_3630;
                                    auVar29._8_4_ = uStack_3628;
                                    auVar29._12_4_ = uStack_3624;
                                    auVar4 = vsubps_avx(auVar29,auVar55);
                                    auVar28._4_4_ = uStack_363c;
                                    auVar28._0_4_ = local_3640;
                                    auVar28._8_4_ = uStack_3638;
                                    auVar28._12_4_ = uStack_3634;
                                    auVar5 = vsubps_avx(auVar28,auVar57);
                                    auVar27._4_4_ = uStack_364c;
                                    auVar27._0_4_ = local_3650;
                                    auVar27._8_4_ = uStack_3648;
                                    auVar27._12_4_ = uStack_3644;
                                    auVar6 = vsubps_avx(auVar27,auVar56);
                                    auVar67 = vsubps_avx(local_3980,auVar55);
                                    auVar68 = vsubps_avx(local_3610,auVar57);
                                    auVar69 = vsubps_avx(local_3620,auVar56);
                                    auVar55 = vsubps_avx(local_3950,auVar55);
                                    auVar59 = vsubps_avx512vl(local_3960,auVar57);
                                    auVar60 = vsubps_avx512vl(local_3970,auVar56);
                                    auVar57 = vsubps_avx(auVar55,auVar4);
                                    auVar61 = vsubps_avx512vl(auVar59,auVar5);
                                    auVar64 = vsubps_avx512vl(auVar60,auVar6);
                                    auVar56 = vsubps_avx(auVar4,auVar67);
                                    auVar70 = vsubps_avx(auVar5,auVar68);
                                    auVar71 = vsubps_avx(auVar6,auVar69);
                                    auVar65 = vsubps_avx512vl(auVar67,auVar55);
                                    auVar124 = auVar147._0_16_;
                                    auVar66 = vsubps_avx512vl(auVar68,auVar59);
                                    auVar76 = vsubps_avx512vl(auVar69,auVar60);
                                    auVar63 = vaddps_avx512vl(auVar55,auVar4);
                                    auVar77 = vaddps_avx512vl(auVar59,auVar5);
                                    auVar78 = vaddps_avx512vl(auVar60,auVar6);
                                    auVar79 = vmulps_avx512vl(auVar77,auVar64);
                                    auVar79 = vfmsub231ps_avx512vl(auVar79,auVar61,auVar78);
                                    auVar78 = vmulps_avx512vl(auVar78,auVar57);
                                    auVar78 = vfmsub231ps_avx512vl(auVar78,auVar64,auVar63);
                                    auVar63 = vmulps_avx512vl(auVar63,auVar61);
                                    auVar63 = vfmsub231ps_avx512vl(auVar63,auVar57,auVar77);
                                    auVar63 = vmulps_avx512vl(auVar63,auVar127);
                                    auVar63 = vfmadd231ps_avx512vl(auVar63,auVar126,auVar78);
                                    auVar77 = vfmadd231ps_avx512vl(auVar63,auVar54,auVar79);
                                    auVar63 = vaddps_avx512vl(auVar4,auVar67);
                                    auVar78 = vaddps_avx512vl(auVar5,auVar68);
                                    auVar79 = vaddps_avx512vl(auVar6,auVar69);
                                    auVar80 = vmulps_avx512vl(auVar78,auVar71);
                                    auVar80 = vfmsub231ps_avx512vl(auVar80,auVar70,auVar79);
                                    auVar79 = vmulps_avx512vl(auVar79,auVar56);
                                    auVar79 = vfmsub231ps_avx512vl(auVar79,auVar71,auVar63);
                                    auVar63 = vmulps_avx512vl(auVar63,auVar70);
                                    auVar63 = vfmsub231ps_avx512vl(auVar63,auVar56,auVar78);
                                    auVar63 = vmulps_avx512vl(auVar63,auVar127);
                                    auVar147 = ZEXT1664(auVar124);
                                    auVar63 = vfmadd231ps_avx512vl(auVar63,auVar126,auVar79);
                                    auVar63 = vfmadd231ps_avx512vl(auVar63,auVar54,auVar80);
                                    auVar135._0_4_ = auVar67._0_4_ + auVar55._0_4_;
                                    auVar135._4_4_ = auVar67._4_4_ + auVar55._4_4_;
                                    auVar135._8_4_ = auVar67._8_4_ + auVar55._8_4_;
                                    auVar135._12_4_ = auVar67._12_4_ + auVar55._12_4_;
                                    auVar55 = vaddps_avx512vl(auVar68,auVar59);
                                    auVar67 = vaddps_avx512vl(auVar69,auVar60);
                                    auVar68 = vmulps_avx512vl(auVar55,auVar76);
                                    auVar68 = vfmsub231ps_avx512vl(auVar68,auVar66,auVar67);
                                    auVar67 = vmulps_avx512vl(auVar67,auVar65);
                                    auVar67 = vfmsub231ps_avx512vl(auVar67,auVar76,auVar135);
                                    auVar69 = vmulps_avx512vl(auVar135,auVar66);
                                    auVar55 = vfmsub231ps_avx512vl(auVar69,auVar65,auVar55);
                                    auVar136._0_4_ = auVar55._0_4_ * auVar127._0_4_;
                                    auVar136._4_4_ = auVar55._4_4_ * auVar127._4_4_;
                                    auVar136._8_4_ = auVar55._8_4_ * auVar127._8_4_;
                                    auVar136._12_4_ = auVar55._12_4_ * auVar127._12_4_;
                                    auVar55 = vfmadd231ps_fma(auVar136,auVar126,auVar67);
                                    auVar67 = vfmadd231ps_fma(auVar55,auVar54,auVar68);
                                    auVar55 = vaddps_avx512vl(auVar77,auVar63);
                                    auVar139._0_4_ = auVar67._0_4_ + auVar55._0_4_;
                                    auVar139._4_4_ = auVar67._4_4_ + auVar55._4_4_;
                                    auVar139._8_4_ = auVar67._8_4_ + auVar55._8_4_;
                                    auVar139._12_4_ = auVar67._12_4_ + auVar55._12_4_;
                                    auVar59 = auVar143._0_16_;
                                    auVar55 = vandps_avx512vl(auVar139,auVar59);
                                    auVar21._8_4_ = 0x34000000;
                                    auVar21._0_8_ = 0x3400000034000000;
                                    auVar21._12_4_ = 0x34000000;
                                    auVar68 = vmulps_avx512vl(auVar55,auVar21);
                                    auVar55 = vminps_avx512vl(auVar77,auVar63);
                                    auVar55 = vminps_avx(auVar55,auVar67);
                                    auVar69 = vxorps_avx512vl(auVar68,auVar124);
                                    uVar16 = vcmpps_avx512vl(auVar55,auVar69,5);
                                    auVar55 = vmaxps_avx512vl(auVar77,auVar63);
                                    auVar55 = vmaxps_avx(auVar55,auVar67);
                                    uVar18 = vcmpps_avx512vl(auVar55,auVar68,2);
                                    bVar49 = ((byte)uVar16 | (byte)uVar18) & 0xf & (byte)uVar31;
                                    uVar51 = (uint)bVar49;
                                    if (bVar49 == 0) {
LAB_0082b4e3:
                                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                      auVar73 = local_38d0;
                                      auVar63 = local_38e0;
                                      local_3970 = local_38f0;
                                      local_39f0 = auVar72;
                                      local_39c0 = auVar74;
                                    }
                                    else {
                                      auVar137._0_4_ = auVar70._0_4_ * auVar64._0_4_;
                                      auVar137._4_4_ = auVar70._4_4_ * auVar64._4_4_;
                                      auVar137._8_4_ = auVar70._8_4_ * auVar64._8_4_;
                                      auVar137._12_4_ = auVar70._12_4_ * auVar64._12_4_;
                                      auVar140._0_4_ = auVar71._0_4_ * auVar57._0_4_;
                                      auVar140._4_4_ = auVar71._4_4_ * auVar57._4_4_;
                                      auVar140._8_4_ = auVar71._8_4_ * auVar57._8_4_;
                                      auVar140._12_4_ = auVar71._12_4_ * auVar57._12_4_;
                                      auVar142._0_4_ = auVar56._0_4_ * auVar61._0_4_;
                                      auVar142._4_4_ = auVar56._4_4_ * auVar61._4_4_;
                                      auVar142._8_4_ = auVar56._8_4_ * auVar61._8_4_;
                                      auVar142._12_4_ = auVar56._12_4_ * auVar61._12_4_;
                                      auVar68 = vmulps_avx512vl(auVar66,auVar71);
                                      auVar69 = vmulps_avx512vl(auVar56,auVar76);
                                      auVar60 = vmulps_avx512vl(auVar65,auVar70);
                                      auVar55 = vfmsub213ps_fma(auVar61,auVar71,auVar137);
                                      auVar67 = vfmsub213ps_fma(auVar64,auVar56,auVar140);
                                      auVar57 = vfmsub213ps_fma(auVar57,auVar70,auVar142);
                                      auVar70 = vfmsub213ps_avx512vl(auVar76,auVar70,auVar68);
                                      auVar71 = vfmsub213ps_avx512vl(auVar65,auVar71,auVar69);
                                      auVar56 = vfmsub213ps_avx512vl(auVar66,auVar56,auVar60);
                                      auVar61 = vandps_avx512vl(auVar137,auVar59);
                                      auVar68 = vandps_avx512vl(auVar68,auVar59);
                                      uVar40 = vcmpps_avx512vl(auVar61,auVar68,1);
                                      auVar68 = vandps_avx512vl(auVar140,auVar59);
                                      auVar69 = vandps_avx512vl(auVar69,auVar59);
                                      uVar34 = vcmpps_avx512vl(auVar68,auVar69,1);
                                      auVar68 = vandps_avx512vl(auVar142,auVar59);
                                      auVar69 = vandps_avx512vl(auVar60,auVar59);
                                      uVar17 = vcmpps_avx512vl(auVar68,auVar69,1);
                                      bVar52 = (bool)((byte)uVar40 & 1);
                                      local_39f0._0_4_ =
                                           (uint)bVar52 * auVar55._0_4_ |
                                           (uint)!bVar52 * auVar70._0_4_;
                                      bVar52 = (bool)((byte)(uVar40 >> 1) & 1);
                                      local_39f0._4_4_ =
                                           (uint)bVar52 * auVar55._4_4_ |
                                           (uint)!bVar52 * auVar70._4_4_;
                                      bVar52 = (bool)((byte)(uVar40 >> 2) & 1);
                                      local_39f0._8_4_ =
                                           (uint)bVar52 * auVar55._8_4_ |
                                           (uint)!bVar52 * auVar70._8_4_;
                                      bVar52 = (bool)((byte)(uVar40 >> 3) & 1);
                                      local_39f0._12_4_ =
                                           (uint)bVar52 * auVar55._12_4_ |
                                           (uint)!bVar52 * auVar70._12_4_;
                                      bVar52 = (bool)((byte)uVar34 & 1);
                                      auVar73._0_4_ =
                                           (uint)bVar52 * auVar67._0_4_ |
                                           (uint)!bVar52 * auVar71._0_4_;
                                      bVar52 = (bool)((byte)(uVar34 >> 1) & 1);
                                      auVar73._4_4_ =
                                           (uint)bVar52 * auVar67._4_4_ |
                                           (uint)!bVar52 * auVar71._4_4_;
                                      bVar52 = (bool)((byte)(uVar34 >> 2) & 1);
                                      auVar73._8_4_ =
                                           (uint)bVar52 * auVar67._8_4_ |
                                           (uint)!bVar52 * auVar71._8_4_;
                                      bVar52 = (bool)((byte)(uVar34 >> 3) & 1);
                                      auVar73._12_4_ =
                                           (uint)bVar52 * auVar67._12_4_ |
                                           (uint)!bVar52 * auVar71._12_4_;
                                      bVar52 = (bool)((byte)uVar17 & 1);
                                      local_39c0._0_4_ =
                                           (uint)bVar52 * auVar57._0_4_ |
                                           (uint)!bVar52 * auVar56._0_4_;
                                      bVar52 = (bool)((byte)(uVar17 >> 1) & 1);
                                      local_39c0._4_4_ =
                                           (uint)bVar52 * auVar57._4_4_ |
                                           (uint)!bVar52 * auVar56._4_4_;
                                      bVar52 = (bool)((byte)(uVar17 >> 2) & 1);
                                      local_39c0._8_4_ =
                                           (uint)bVar52 * auVar57._8_4_ |
                                           (uint)!bVar52 * auVar56._8_4_;
                                      bVar52 = (bool)((byte)(uVar17 >> 3) & 1);
                                      local_39c0._12_4_ =
                                           (uint)bVar52 * auVar57._12_4_ |
                                           (uint)!bVar52 * auVar56._12_4_;
                                      auVar55 = vmulps_avx512vl(auVar127,local_39c0);
                                      auVar55 = vfmadd213ps_avx512vl(auVar126,auVar73,auVar55);
                                      auVar55 = vfmadd213ps_avx512vl(auVar54,local_39f0,auVar55);
                                      auVar115._0_4_ = auVar55._0_4_ + auVar55._0_4_;
                                      auVar115._4_4_ = auVar55._4_4_ + auVar55._4_4_;
                                      auVar115._8_4_ = auVar55._8_4_ + auVar55._8_4_;
                                      auVar115._12_4_ = auVar55._12_4_ + auVar55._12_4_;
                                      auVar55 = vmulps_avx512vl(auVar6,local_39c0);
                                      auVar55 = vfmadd213ps_avx512vl(auVar5,auVar73,auVar55);
                                      auVar57 = vfmadd213ps_avx512vl(auVar4,local_39f0,auVar55);
                                      auVar55 = vrcp14ps_avx512vl(auVar115);
                                      auVar56 = vxorps_avx512vl(auVar115,auVar124);
                                      auVar54 = vfnmadd213ps_avx512vl(auVar55,auVar115,auVar58);
                                      auVar55 = vfmadd132ps_fma(auVar54,auVar55,auVar55);
                                      local_3970._0_4_ =
                                           (auVar57._0_4_ + auVar57._0_4_) * auVar55._0_4_;
                                      local_3970._4_4_ =
                                           (auVar57._4_4_ + auVar57._4_4_) * auVar55._4_4_;
                                      local_3970._8_4_ =
                                           (auVar57._8_4_ + auVar57._8_4_) * auVar55._8_4_;
                                      local_3970._12_4_ =
                                           (auVar57._12_4_ + auVar57._12_4_) * auVar55._12_4_;
                                      uVar16 = vcmpps_avx512vl(local_3970,
                                                               *(undefined1 (*) [16])
                                                                (pRVar43 + 0x80),2);
                                      uVar18 = vcmpps_avx512vl(local_3970,
                                                               *(undefined1 (*) [16])
                                                                (pRVar43 + 0x30),0xd);
                                      uVar19 = vcmpps_avx512vl(auVar115,auVar56,4);
                                      bVar49 = bVar49 & (byte)uVar16 & (byte)uVar18 & (byte)uVar19;
                                      uVar51 = (uint)bVar49;
                                      if (bVar49 == 0) goto LAB_0082b4e3;
                                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                      local_3a10 = auVar139;
                                      auVar62 = auVar77;
                                    }
                                    in_ZMM10 = ZEXT1664(local_3970);
                                    in_ZMM30 = ZEXT1664(auVar62);
                                    in_ZMM29 = ZEXT1664(auVar63);
                                    in_ZMM27 = ZEXT1664(local_3a10);
                                    auVar146 = ZEXT1664(auVar55);
                                    auVar145 = ZEXT1664(auVar56);
                                    auVar144 = ZEXT1664(auVar57);
                                    bVar49 = (byte)uVar51;
                                    if (bVar49 != 0) {
                                      auVar57 = vsubps_avx512vl(local_3a10,auVar62);
                                      auVar56 = vsubps_avx512vl(local_3a10,auVar63);
                                      auVar55 = vcvtsi2ss_avx512f(auVar59,*(ushort *)
                                                                           (lVar42 + 8 + lVar35) - 1
                                                                 );
                                      auVar105._4_12_ = ZEXT812(0) << 0x20;
                                      auVar105._0_4_ = auVar55._0_4_;
                                      auVar54 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar105);
                                      auVar55 = vfnmadd213ss_fma(auVar55,auVar54,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar88 = auVar54._0_4_ * auVar55._0_4_;
                                      auVar55 = vcvtsi2ss_avx512f(auVar59,*(ushort *)
                                                                           (lVar42 + 10 + lVar35) -
                                                                          1);
                                      auVar116._4_12_ = ZEXT812(0) << 0x20;
                                      auVar116._0_4_ = auVar55._0_4_;
                                      auVar54 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar116);
                                      auVar55 = vfnmadd213ss_fma(auVar55,auVar54,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar15 = auVar54._0_4_ * auVar55._0_4_;
                                      auVar55 = vcvtsi2ss_avx512f(auVar59,((uint)uVar41 & 1) +
                                                                          uVar32);
                                      auVar117._0_4_ = auVar55._0_4_;
                                      auVar117._4_4_ = auVar117._0_4_;
                                      auVar117._8_4_ = auVar117._0_4_;
                                      auVar117._12_4_ = auVar117._0_4_;
                                      auVar55 = vmulps_avx512vl(auVar117,local_3a10);
                                      auVar55 = vaddps_avx512vl(auVar57,auVar55);
                                      auVar98._4_4_ = fVar88;
                                      auVar98._0_4_ = fVar88;
                                      auVar98._8_4_ = fVar88;
                                      auVar98._12_4_ = fVar88;
                                      auVar55 = vmulps_avx512vl(auVar55,auVar98);
                                      auVar81._0_4_ =
                                           (uint)(bVar49 & 1) * auVar55._0_4_ |
                                           (uint)!(bool)(bVar49 & 1) * auVar57._0_4_;
                                      bVar52 = (bool)((byte)(uVar51 >> 1) & 1);
                                      auVar81._4_4_ =
                                           (uint)bVar52 * auVar55._4_4_ |
                                           (uint)!bVar52 * auVar57._4_4_;
                                      bVar52 = (bool)((byte)(uVar51 >> 2) & 1);
                                      auVar81._8_4_ =
                                           (uint)bVar52 * auVar55._8_4_ |
                                           (uint)!bVar52 * auVar57._8_4_;
                                      auVar81._12_4_ =
                                           (uVar51 >> 3) * auVar55._12_4_ |
                                           (uint)!SUB41(uVar51 >> 3,0) * auVar57._12_4_;
                                      in_ZMM30 = ZEXT1664(auVar81);
                                      auVar55 = vcvtsi2ss_avx512f(auVar59,((uint)(uVar41 >> 1) &
                                                                          0x7fffffff) + local_39c4);
                                      auVar99._0_4_ = auVar55._0_4_;
                                      auVar99._4_4_ = auVar99._0_4_;
                                      auVar99._8_4_ = auVar99._0_4_;
                                      auVar99._12_4_ = auVar99._0_4_;
                                      auVar55 = vmulps_avx512vl(auVar99,local_3a10);
                                      auVar55 = vaddps_avx512vl(auVar56,auVar55);
                                      auVar106._4_4_ = fVar15;
                                      auVar106._0_4_ = fVar15;
                                      auVar106._8_4_ = fVar15;
                                      auVar106._12_4_ = fVar15;
                                      auVar55 = vmulps_avx512vl(auVar55,auVar106);
                                      local_3950._0_4_ =
                                           (uint)(bVar49 & 1) * auVar55._0_4_ |
                                           (uint)!(bool)(bVar49 & 1) * auVar56._0_4_;
                                      bVar52 = (bool)((byte)(uVar51 >> 1) & 1);
                                      local_3950._4_4_ =
                                           (uint)bVar52 * auVar55._4_4_ |
                                           (uint)!bVar52 * auVar56._4_4_;
                                      bVar52 = (bool)((byte)(uVar51 >> 2) & 1);
                                      local_3950._8_4_ =
                                           (uint)bVar52 * auVar55._8_4_ |
                                           (uint)!bVar52 * auVar56._8_4_;
                                      local_3950._12_4_ =
                                           (uVar51 >> 3) * auVar55._12_4_ |
                                           (uint)!SUB41(uVar51 >> 3,0) * auVar56._12_4_;
                                      in_ZMM29 = ZEXT1664(local_3950);
                                      pGVar9 = (context->scene->geometries).items
                                               [*(uint *)(local_36a0 + uVar41 * 4)].ptr;
                                      uVar51 = pGVar9->mask;
                                      auVar100._4_4_ = uVar51;
                                      auVar100._0_4_ = uVar51;
                                      auVar100._8_4_ = uVar51;
                                      auVar100._12_4_ = uVar51;
                                      uVar16 = vptestmd_avx512vl(auVar100,*(undefined1 (*) [16])
                                                                           (pRVar43 + 0x90));
                                      bVar49 = (byte)uVar16 & 0xf & bVar49;
                                      uVar40 = (ulong)bVar49;
                                      if (bVar49 != 0) {
                                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                           (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                          auVar55 = vandps_avx512vl(local_3a10,auVar59);
                                          auVar22._8_4_ = 0x219392ef;
                                          auVar22._0_8_ = 0x219392ef219392ef;
                                          auVar22._12_4_ = 0x219392ef;
                                          uVar40 = vcmpps_avx512vl(auVar55,auVar22,5);
                                          auVar55 = vrcp14ps_avx512vl(local_3a10);
                                          auVar119._8_4_ = 0x3f800000;
                                          auVar119._0_8_ = &DAT_3f8000003f800000;
                                          auVar119._12_4_ = 0x3f800000;
                                          auVar57 = vfnmadd213ps_avx512vl
                                                              (auVar55,local_3a10,auVar119);
                                          auVar55 = vfmadd132ps_avx512vl(auVar57,auVar55,auVar55);
                                          auVar84._4_4_ =
                                               (uint)((byte)(uVar40 >> 1) & 1) * auVar55._4_4_;
                                          auVar84._0_4_ = (uint)((byte)uVar40 & 1) * auVar55._0_4_;
                                          auVar84._8_4_ =
                                               (uint)((byte)(uVar40 >> 2) & 1) * auVar55._8_4_;
                                          auVar84._12_4_ =
                                               (uint)((byte)(uVar40 >> 3) & 1) * auVar55._12_4_;
                                          auVar55 = vmulps_avx512vl(auVar81,auVar84);
                                          local_3730 = vminps_avx(auVar55,auVar119);
                                          auVar55 = vmulps_avx512vl(local_3950,auVar84);
                                          local_3720 = vminps_avx(auVar55,auVar119);
                                          local_3700 = vpbroadcastd_avx512vl();
                                          local_3710 = vpbroadcastd_avx512vl();
                                          auStack_3750 = auVar73;
                                          local_3760 = (RTCHitN  [16])local_39f0;
                                          local_3740 = local_39c0;
                                          vpcmpeqd_avx2(ZEXT1632(local_3730),ZEXT1632(local_3730));
                                          uStack_36ec = context->user->instID[0];
                                          local_36f0 = uStack_36ec;
                                          uStack_36e8 = uStack_36ec;
                                          uStack_36e4 = uStack_36ec;
                                          uStack_36e0 = context->user->instPrimID[0];
                                          uStack_36dc = uStack_36e0;
                                          uStack_36d8 = uStack_36e0;
                                          uStack_36d4 = uStack_36e0;
                                          local_3980 = *(undefined1 (*) [16])(pRVar43 + 0x80);
                                          auVar55 = vblendmps_avx512vl(local_3980,local_3970);
                                          bVar52 = (bool)(bVar49 >> 1 & 1);
                                          bVar12 = (bool)(bVar49 >> 2 & 1);
                                          *(uint *)(pRVar43 + 0x80) =
                                               (uint)(bVar49 & 1) * auVar55._0_4_ |
                                               !(bool)(bVar49 & 1) * uStack_36e0;
                                          *(uint *)(pRVar43 + 0x84) =
                                               (uint)bVar52 * auVar55._4_4_ | !bVar52 * uStack_36e0;
                                          *(uint *)(pRVar43 + 0x88) =
                                               (uint)bVar12 * auVar55._8_4_ | !bVar12 * uStack_36e0;
                                          *(uint *)(pRVar43 + 0x8c) =
                                               (uint)(bVar49 >> 3) * auVar55._12_4_ |
                                               !(bool)(bVar49 >> 3) * uStack_36e0;
                                          auVar55 = vpmovm2d_avx512vl((ulong)bVar49);
                                          local_38c0._0_16_ = auVar55;
                                          local_3920.geometryUserPtr = pGVar9->userPtr;
                                          local_3920.valid = (int *)local_38c0;
                                          local_3920.context = context->user;
                                          local_3920.ray = (RTCRayN *)pRVar43;
                                          local_3920.hit = local_3760;
                                          local_3920.N = 4;
                                          local_39d0 = lVar42;
                                          local_39a8 = lVar35;
                                          local_3990 = auVar73;
                                          local_3960 = local_3a10;
                                          if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                            (*pGVar9->occlusionFilterN)(&local_3920);
                                            in_ZMM10 = ZEXT1664(local_3970);
                                            in_ZMM27 = ZEXT1664(local_3960);
                                            in_ZMM29 = ZEXT1664(local_3950);
                                            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar147 = ZEXT1664(auVar55);
                                            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                            auVar146 = ZEXT1664(auVar55);
                                            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                            auVar145 = ZEXT1664(auVar55);
                                            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar144 = ZEXT1664(auVar55);
                                            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                            auVar143 = ZEXT1664(auVar55);
                                            pRVar43 = local_39e0;
                                            context = local_39d8;
                                          }
                                          uVar40 = vptestmd_avx512vl(local_38c0._0_16_,
                                                                     local_38c0._0_16_);
                                          uVar40 = uVar40 & 0xf;
                                          auVar73 = local_3990;
                                          if ((char)uVar40 != '\0') {
                                            p_Var11 = context->args->filter;
                                            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                               (((context->args->flags &
                                                 RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                                              (*p_Var11)(&local_3920);
                                              in_ZMM10 = ZEXT1664(local_3970);
                                              in_ZMM27 = ZEXT1664(local_3960);
                                              in_ZMM29 = ZEXT1664(local_3950);
                                              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                              auVar147 = ZEXT1664(auVar55);
                                              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                              auVar146 = ZEXT1664(auVar55);
                                              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                              auVar145 = ZEXT1664(auVar55);
                                              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                              auVar144 = ZEXT1664(auVar55);
                                              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                              auVar143 = ZEXT1664(auVar55);
                                              pRVar43 = local_39e0;
                                              context = local_39d8;
                                            }
                                            uVar40 = vptestmd_avx512vl(local_38c0._0_16_,
                                                                       local_38c0._0_16_);
                                            uVar40 = uVar40 & 0xf;
                                            auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                            bVar52 = (bool)((byte)uVar40 & 1);
                                            auVar85._0_4_ =
                                                 (uint)bVar52 * auVar55._0_4_ |
                                                 (uint)!bVar52 * *(int *)(local_3920.ray + 0x80);
                                            bVar52 = (bool)((byte)(uVar40 >> 1) & 1);
                                            auVar85._4_4_ =
                                                 (uint)bVar52 * auVar55._4_4_ |
                                                 (uint)!bVar52 * *(int *)(local_3920.ray + 0x84);
                                            bVar52 = (bool)((byte)(uVar40 >> 2) & 1);
                                            auVar85._8_4_ =
                                                 (uint)bVar52 * auVar55._8_4_ |
                                                 (uint)!bVar52 * *(int *)(local_3920.ray + 0x88);
                                            bVar52 = SUB81(uVar40 >> 3,0);
                                            auVar85._12_4_ =
                                                 (uint)bVar52 * auVar55._12_4_ |
                                                 (uint)!bVar52 * *(int *)(local_3920.ray + 0x8c);
                                            *(undefined1 (*) [16])(local_3920.ray + 0x80) = auVar85;
                                            auVar73 = local_3990;
                                          }
                                          bVar52 = (bool)((byte)uVar40 & 1);
                                          auVar87._0_4_ =
                                               (uint)bVar52 * *(int *)local_3938 |
                                               (uint)!bVar52 * local_3980._0_4_;
                                          bVar52 = (bool)((byte)(uVar40 >> 1) & 1);
                                          auVar87._4_4_ =
                                               (uint)bVar52 * *(int *)(local_3938 + 4) |
                                               (uint)!bVar52 * local_3980._4_4_;
                                          bVar52 = (bool)((byte)(uVar40 >> 2) & 1);
                                          auVar87._8_4_ =
                                               (uint)bVar52 * *(int *)(local_3938 + 8) |
                                               (uint)!bVar52 * local_3980._8_4_;
                                          bVar52 = SUB81(uVar40 >> 3,0);
                                          auVar87._12_4_ =
                                               (uint)bVar52 * *(int *)(local_3938 + 0xc) |
                                               (uint)!bVar52 * local_3980._12_4_;
                                          *(undefined1 (*) [16])local_3938 = auVar87;
                                          lVar42 = local_39d0;
                                          lVar35 = local_39a8;
                                        }
                                        in_ZMM30 = ZEXT1664(auVar81);
                                        uVar31 = (ushort)(byte)(((byte)uVar40 ^ 0xf) & (byte)uVar31)
                                        ;
                                      }
                                    }
                                  }
                                  local_3990 = auVar73;
                                  if ((byte)uVar31 == 0) break;
                                  uVar40 = uVar41 + 1;
                                  puVar39 = puVar39 + 0x10;
                                } while (uVar41 < 3);
                                bVar36 = bVar36 & (byte)uVar31;
                                uVar31 = (ushort)bVar36;
                                bVar52 = bVar36 == 0;
                                lVar37 = local_3870;
                                uVar41 = local_3868;
                                uVar40 = local_3930;
                                puVar44 = local_3998;
                                pauVar46 = local_39a0;
                              }
                            } while ((!bVar52) && (uVar41 = uVar41 - 1 & uVar41, uVar41 != 0));
                          }
                          lVar37 = local_3878 + 1;
                        } while (lVar37 != local_3880);
                        bVar36 = ~(byte)uVar31 & 0xf;
                      }
                      bVar36 = (byte)uVar50 | bVar36;
                      uVar50 = (ushort)bVar36;
                      if (bVar36 == 0xf) goto LAB_0082bcab;
                      auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      local_3770._0_4_ =
                           (uint)(bVar36 & 1) * auVar55._0_4_ |
                           (uint)!(bool)(bVar36 & 1) * local_3770._0_4_;
                      bVar52 = (bool)(bVar36 >> 1 & 1);
                      local_3770._4_4_ =
                           (uint)bVar52 * auVar55._4_4_ | (uint)!bVar52 * local_3770._4_4_;
                      bVar52 = (bool)(bVar36 >> 2 & 1);
                      local_3770._8_4_ =
                           (uint)bVar52 * auVar55._8_4_ | (uint)!bVar52 * local_3770._8_4_;
                      bVar52 = (bool)(bVar36 >> 3 & 1);
                      local_3770._12_4_ =
                           (uint)bVar52 * auVar55._12_4_ | (uint)!bVar52 * local_3770._12_4_;
                      iVar33 = 0;
                      break;
                    }
                    goto LAB_0082bce0;
                  }
                  auVar131 = ZEXT1664(auVar144._0_16_);
                  uVar53 = 0;
                  uVar41 = 8;
                  do {
                    uVar34 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar53 * 8);
                    if (uVar34 != 8) {
                      uVar47 = *(undefined4 *)(root.ptr + 0x40 + uVar53 * 4);
                      auVar89._4_4_ = uVar47;
                      auVar89._0_4_ = uVar47;
                      auVar89._8_4_ = uVar47;
                      auVar89._12_4_ = uVar47;
                      auVar24._8_8_ = local_3840._8_8_;
                      auVar24._0_8_ = local_3840._0_8_;
                      auVar25._8_8_ = local_3840._24_8_;
                      auVar25._0_8_ = local_3840._16_8_;
                      auVar26._8_8_ = local_3840._40_8_;
                      auVar26._0_8_ = local_3840._32_8_;
                      auVar55 = vsubps_avx(auVar89,auVar24);
                      auVar125._0_4_ = (float)local_37e0._0_4_ * auVar55._0_4_;
                      auVar125._4_4_ = (float)local_37e0._4_4_ * auVar55._4_4_;
                      auVar125._8_4_ = fStack_37d8 * auVar55._8_4_;
                      auVar125._12_4_ = fStack_37d4 * auVar55._12_4_;
                      uVar47 = *(undefined4 *)(root.ptr + 0x80 + uVar53 * 4);
                      auVar90._4_4_ = uVar47;
                      auVar90._0_4_ = uVar47;
                      auVar90._8_4_ = uVar47;
                      auVar90._12_4_ = uVar47;
                      auVar55 = vsubps_avx(auVar90,auVar25);
                      auVar128._0_4_ = local_37d0._0_4_ * auVar55._0_4_;
                      auVar128._4_4_ = local_37d0._4_4_ * auVar55._4_4_;
                      auVar128._8_4_ = local_37d0._8_4_ * auVar55._8_4_;
                      auVar128._12_4_ = local_37d0._12_4_ * auVar55._12_4_;
                      uVar47 = *(undefined4 *)(root.ptr + 0xc0 + uVar53 * 4);
                      auVar91._4_4_ = uVar47;
                      auVar91._0_4_ = uVar47;
                      auVar91._8_4_ = uVar47;
                      auVar91._12_4_ = uVar47;
                      auVar55 = vsubps_avx(auVar91,auVar26);
                      auVar129._0_4_ = local_37c0._0_4_ * auVar55._0_4_;
                      auVar129._4_4_ = local_37c0._4_4_ * auVar55._4_4_;
                      auVar129._8_4_ = local_37c0._8_4_ * auVar55._8_4_;
                      auVar129._12_4_ = local_37c0._12_4_ * auVar55._12_4_;
                      uVar47 = *(undefined4 *)(root.ptr + 0x60 + uVar53 * 4);
                      auVar92._4_4_ = uVar47;
                      auVar92._0_4_ = uVar47;
                      auVar92._8_4_ = uVar47;
                      auVar92._12_4_ = uVar47;
                      auVar55 = vsubps_avx(auVar92,auVar24);
                      auVar102._0_4_ = (float)local_37e0._0_4_ * auVar55._0_4_;
                      auVar102._4_4_ = (float)local_37e0._4_4_ * auVar55._4_4_;
                      auVar102._8_4_ = fStack_37d8 * auVar55._8_4_;
                      auVar102._12_4_ = fStack_37d4 * auVar55._12_4_;
                      uVar47 = *(undefined4 *)(root.ptr + 0xa0 + uVar53 * 4);
                      auVar93._4_4_ = uVar47;
                      auVar93._0_4_ = uVar47;
                      auVar93._8_4_ = uVar47;
                      auVar93._12_4_ = uVar47;
                      auVar55 = vsubps_avx(auVar93,auVar25);
                      auVar111._0_4_ = local_37d0._0_4_ * auVar55._0_4_;
                      auVar111._4_4_ = local_37d0._4_4_ * auVar55._4_4_;
                      auVar111._8_4_ = local_37d0._8_4_ * auVar55._8_4_;
                      auVar111._12_4_ = local_37d0._12_4_ * auVar55._12_4_;
                      uVar47 = *(undefined4 *)(root.ptr + 0xe0 + uVar53 * 4);
                      auVar94._4_4_ = uVar47;
                      auVar94._0_4_ = uVar47;
                      auVar94._8_4_ = uVar47;
                      auVar94._12_4_ = uVar47;
                      auVar55 = vsubps_avx(auVar94,auVar26);
                      auVar123._0_4_ = local_37c0._0_4_ * auVar55._0_4_;
                      auVar123._4_4_ = local_37c0._4_4_ * auVar55._4_4_;
                      auVar123._8_4_ = local_37c0._8_4_ * auVar55._8_4_;
                      auVar123._12_4_ = local_37c0._12_4_ * auVar55._12_4_;
                      auVar55 = vminps_avx(auVar125,auVar102);
                      auVar57 = vminps_avx(auVar128,auVar111);
                      auVar55 = vmaxps_avx(auVar55,auVar57);
                      auVar57 = vminps_avx(auVar129,auVar123);
                      auVar55 = vmaxps_avx(auVar55,auVar57);
                      auVar56 = vmulps_avx512vl(auVar55,auVar145._0_16_);
                      auVar55 = vmaxps_avx(auVar125,auVar102);
                      auVar57 = vmaxps_avx(auVar128,auVar111);
                      auVar57 = vminps_avx(auVar55,auVar57);
                      auVar55 = vmaxps_avx(auVar129,auVar123);
                      auVar55 = vminps_avx(auVar57,auVar55);
                      auVar57 = vmulps_avx512vl(auVar55,auVar146._0_16_);
                      auVar55 = vmaxps_avx(auVar56,local_3780);
                      auVar57 = vminps_avx(auVar57,local_3770);
                      uVar17 = vcmpps_avx512vl(auVar55,auVar57,2);
                      if ((byte)uVar17 != 0) {
                        auVar55 = vblendmps_avx512vl(auVar144._0_16_,auVar56);
                        bVar52 = (bool)((byte)uVar17 & 1);
                        bVar12 = (bool)((byte)(uVar17 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar17 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
                        if (uVar41 != 8) {
                          *puVar44 = uVar41;
                          puVar44 = puVar44 + 1;
                          *pauVar46 = auVar131._0_16_;
                          pauVar46 = pauVar46 + 1;
                        }
                        auVar131 = ZEXT1664(CONCAT412((uint)bVar14 * auVar55._12_4_ |
                                                      (uint)!bVar14 * auVar56._12_4_,
                                                      CONCAT48((uint)bVar13 * auVar55._8_4_ |
                                                               (uint)!bVar13 * auVar56._8_4_,
                                                               CONCAT44((uint)bVar12 * auVar55._4_4_
                                                                        | (uint)!bVar12 *
                                                                          auVar56._4_4_,
                                                                        (uint)bVar52 * auVar55._0_4_
                                                                        | (uint)!bVar52 *
                                                                          auVar56._0_4_))));
                        uVar41 = uVar34;
                      }
                    }
                  } while ((uVar34 != 8) && (bVar52 = uVar53 < 7, uVar53 = uVar53 + 1, bVar52));
                  iVar33 = 0;
                  if (uVar41 == 8) {
LAB_0082a6df:
                    bVar52 = false;
                    iVar33 = 4;
                  }
                  else {
                    uVar16 = vcmpps_avx512vl(auVar131._0_16_,local_3770,9);
                    bVar52 = true;
                    if ((uint)POPCOUNT((int)uVar16) <= uVar40) {
                      *puVar44 = uVar41;
                      puVar44 = puVar44 + 1;
                      *pauVar46 = auVar131._0_16_;
                      pauVar46 = pauVar46 + 1;
                      goto LAB_0082a6df;
                    }
                  }
                  root.ptr = uVar41;
                } while (bVar52);
              }
            }
          }
        } while (iVar33 != 3);
        local_3924._0_1_ = (byte)uVar50 & (byte)local_3924;
        bVar52 = (bool)((byte)local_3924 >> 1 & 1);
        bVar12 = (bool)((byte)local_3924 >> 2 & 1);
        bVar13 = (bool)((byte)local_3924 >> 3 & 1);
        *(uint *)local_3938 =
             (uint)((byte)local_3924 & 1) * -0x800000 |
             (uint)!(bool)((byte)local_3924 & 1) * *(int *)local_3938;
        *(uint *)(local_3938 + 4) =
             (uint)bVar52 * -0x800000 | (uint)!bVar52 * *(int *)(local_3938 + 4);
        *(uint *)(local_3938 + 8) =
             (uint)bVar12 * -0x800000 | (uint)!bVar12 * *(int *)(local_3938 + 8);
        *(uint *)(local_3938 + 0xc) =
             (uint)bVar13 * -0x800000 | (uint)!bVar13 * *(int *)(local_3938 + 0xc);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }